

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.t.cpp
# Opt level: O0

void relop<char,int,long>(env *lest_env)

{
  ostream *poVar1;
  bool bVar2;
  __optional_eq_t<int,_char> _Var3;
  __optional_eq_t<char,_int> _Var4;
  __optional_lt_t<int,_char> _Var5;
  __optional_le_t<int,_char> _Var6;
  __optional_gt_t<char,_int> _Var7;
  __optional_ge_t<char,_int> _Var8;
  failure *pfVar9;
  text local_7bd0;
  text local_7bb0;
  allocator<char> local_7b89;
  text local_7b88;
  allocator<char> local_7b61;
  text local_7b60;
  location local_7b40;
  message local_7b18;
  undefined1 local_7a99;
  text local_7a98;
  allocator<char> local_7a71;
  text local_7a70;
  allocator<char> local_7a49;
  text local_7a48;
  location local_7a28;
  int local_7a00;
  expression_decomposer local_79f9;
  int *local_79f8;
  undefined1 local_79f0 [8];
  result score_43;
  text local_79c0;
  undefined1 local_79a0 [8];
  ctx lest__ctx_section_43;
  int lest__count_44;
  int lest__section_44;
  text local_7900;
  text local_78e0;
  allocator<char> local_78b9;
  text local_78b8;
  allocator<char> local_7891;
  text local_7890;
  location local_7870;
  message local_7848;
  undefined1 local_77c9;
  text local_77c8;
  allocator<char> local_77a1;
  text local_77a0;
  allocator<char> local_7779;
  text local_7778;
  location local_7758;
  int local_7730;
  expression_decomposer local_7729;
  optional<long> *local_7728;
  undefined1 local_7720 [8];
  result score_42;
  text local_76f0;
  undefined1 local_76d0 [8];
  ctx lest__ctx_section_42;
  int lest__count_43;
  int lest__section_43;
  text local_7630;
  text local_7610;
  allocator<char> local_75e9;
  text local_75e8;
  allocator<char> local_75c1;
  text local_75c0;
  location local_75a0;
  message local_7578;
  undefined1 local_74f9;
  text local_74f8;
  allocator<char> local_74d1;
  text local_74d0;
  allocator<char> local_74a9;
  text local_74a8;
  location local_7488;
  int local_7460;
  expression_decomposer local_7459;
  int *local_7458;
  undefined1 local_7450 [8];
  result score_41;
  text local_7420;
  undefined1 local_7400 [8];
  ctx lest__ctx_section_41;
  int lest__count_42;
  int lest__section_42;
  text local_7360;
  text local_7340;
  allocator<char> local_7319;
  text local_7318;
  allocator<char> local_72f1;
  text local_72f0;
  location local_72d0;
  message local_72a8;
  undefined1 local_7229;
  text local_7228;
  allocator<char> local_7201;
  text local_7200;
  allocator<char> local_71d9;
  text local_71d8;
  location local_71b8;
  int local_7190;
  expression_decomposer local_7189;
  optional<long> *local_7188;
  undefined1 local_7180 [8];
  result score_40;
  text local_7150;
  undefined1 local_7130 [8];
  ctx lest__ctx_section_40;
  int lest__count_41;
  int lest__section_41;
  text local_7090;
  text local_7070;
  allocator<char> local_7049;
  text local_7048;
  allocator<char> local_7021;
  text local_7020;
  location local_7000;
  message local_6fd8;
  undefined1 local_6f59;
  text local_6f58;
  allocator<char> local_6f31;
  text local_6f30;
  allocator<char> local_6f09;
  text local_6f08;
  location local_6ee8;
  int local_6ec0;
  expression_decomposer local_6eb9;
  int *local_6eb8;
  undefined1 local_6eb0 [8];
  result score_39;
  text local_6e80;
  undefined1 local_6e60 [8];
  ctx lest__ctx_section_39;
  int lest__count_40;
  int lest__section_40;
  text local_6dc0;
  text local_6da0;
  allocator<char> local_6d79;
  text local_6d78;
  allocator<char> local_6d51;
  text local_6d50;
  location local_6d30;
  message local_6d08;
  undefined1 local_6c89;
  text local_6c88;
  allocator<char> local_6c61;
  text local_6c60;
  allocator<char> local_6c39;
  text local_6c38;
  location local_6c18;
  int local_6bf0;
  expression_decomposer local_6be9;
  optional<int> *local_6be8;
  undefined1 local_6be0 [8];
  result score_38;
  text local_6bb0;
  undefined1 local_6b90 [8];
  ctx lest__ctx_section_38;
  int lest__count_39;
  int lest__section_39;
  text local_6af0;
  text local_6ad0;
  allocator<char> local_6aa9;
  text local_6aa8;
  allocator<char> local_6a81;
  text local_6a80;
  location local_6a60;
  message local_6a38;
  undefined1 local_69b9;
  text local_69b8;
  allocator<char> local_6991;
  text local_6990;
  allocator<char> local_6969;
  text local_6968;
  location local_6948;
  int local_6920;
  expression_decomposer local_6919;
  int *local_6918;
  undefined1 local_6910 [8];
  result score_37;
  text local_68e0;
  undefined1 local_68c0 [8];
  ctx lest__ctx_section_37;
  int lest__count_38;
  int lest__section_38;
  text local_6820;
  text local_6800;
  allocator<char> local_67d9;
  text local_67d8;
  allocator<char> local_67b1;
  text local_67b0;
  location local_6790;
  message local_6768;
  undefined1 local_66e9;
  text local_66e8;
  allocator<char> local_66c1;
  text local_66c0;
  allocator<char> local_6699;
  text local_6698;
  location local_6678;
  int local_6650;
  expression_decomposer local_6649;
  optional<int> *local_6648;
  undefined1 local_6640 [8];
  result score_36;
  text local_6610;
  undefined1 local_65f0 [8];
  ctx lest__ctx_section_36;
  int lest__count_37;
  int lest__section_37;
  text local_6550;
  text local_6530;
  allocator<char> local_6509;
  text local_6508;
  allocator<char> local_64e1;
  text local_64e0;
  location local_64c0;
  message local_6498;
  undefined1 local_6419;
  text local_6418;
  allocator<char> local_63f1;
  text local_63f0;
  allocator<char> local_63c9;
  text local_63c8;
  location local_63a8;
  int local_6380;
  expression_decomposer local_6379;
  int *local_6378;
  undefined1 local_6370 [8];
  result score_35;
  text local_6340;
  undefined1 local_6320 [8];
  ctx lest__ctx_section_35;
  int lest__count_36;
  int lest__section_36;
  text local_6280;
  text local_6260;
  allocator<char> local_6239;
  text local_6238;
  allocator<char> local_6211;
  text local_6210;
  location local_61f0;
  message local_61c8;
  undefined1 local_6149;
  text local_6148;
  allocator<char> local_6121;
  text local_6120;
  allocator<char> local_60f9;
  text local_60f8;
  location local_60d8;
  int local_60b0;
  expression_decomposer local_60a9;
  optional<int> *local_60a8;
  undefined1 local_60a0 [8];
  result score_34;
  text local_6070;
  undefined1 local_6050 [8];
  ctx lest__ctx_section_34;
  int lest__count_35;
  int lest__section_35;
  text local_5fb0;
  text local_5f90;
  allocator<char> local_5f69;
  text local_5f68;
  allocator<char> local_5f41;
  text local_5f40;
  location local_5f20;
  message local_5ef8;
  undefined1 local_5e79;
  text local_5e78;
  allocator<char> local_5e51;
  text local_5e50;
  allocator<char> local_5e29;
  text local_5e28;
  location local_5e08;
  int local_5de0;
  expression_decomposer local_5dd9;
  int *local_5dd8;
  undefined1 local_5dd0 [8];
  result score_33;
  text local_5da0;
  undefined1 local_5d80 [8];
  ctx lest__ctx_section_33;
  int lest__count_34;
  int lest__section_34;
  text local_5ce0;
  text local_5cc0;
  allocator<char> local_5c99;
  text local_5c98;
  allocator<char> local_5c71;
  text local_5c70;
  location local_5c50;
  message local_5c28;
  undefined1 local_5ba9;
  text local_5ba8;
  allocator<char> local_5b81;
  text local_5b80;
  allocator<char> local_5b59;
  text local_5b58;
  location local_5b38;
  int local_5b10;
  expression_decomposer local_5b09;
  optional<int> *local_5b08;
  undefined1 local_5b00 [8];
  result score_32;
  text local_5ad0;
  undefined1 local_5ab0 [8];
  ctx lest__ctx_section_32;
  int lest__count_33;
  int lest__section_33;
  text local_5a10;
  text local_59f0;
  allocator<char> local_59c9;
  text local_59c8;
  allocator<char> local_59a1;
  text local_59a0;
  location local_5980;
  message local_5958;
  undefined1 local_58d9;
  text local_58d8;
  allocator<char> local_58b1;
  text local_58b0;
  allocator<char> local_5889;
  text local_5888;
  location local_5868;
  bool local_583a;
  expression_decomposer local_5839;
  bool *local_5838;
  undefined1 local_5830 [8];
  result score_31;
  text local_5800;
  undefined1 local_57e0 [8];
  ctx lest__ctx_section_31;
  int lest__count_32;
  int lest__section_32;
  text local_5740;
  text local_5720;
  allocator<char> local_56f9;
  text local_56f8;
  allocator<char> local_56d1;
  text local_56d0;
  location local_56b0;
  message local_5688;
  undefined1 local_5609;
  text local_5608;
  allocator<char> local_55e1;
  text local_55e0;
  allocator<char> local_55b9;
  text local_55b8;
  location local_5598;
  bool local_556a;
  expression_decomposer local_5569;
  bool *local_5568;
  undefined1 local_5560 [8];
  result score_30;
  text local_5530;
  undefined1 local_5510 [8];
  ctx lest__ctx_section_30;
  int lest__count_31;
  int lest__section_31;
  text local_5470;
  text local_5450;
  allocator<char> local_5429;
  text local_5428;
  allocator<char> local_5401;
  text local_5400;
  location local_53e0;
  message local_53b8;
  undefined1 local_5339;
  text local_5338;
  allocator<char> local_5311;
  text local_5310;
  allocator<char> local_52e9;
  text local_52e8;
  location local_52c8;
  bool local_529a;
  expression_decomposer local_5299;
  bool *local_5298;
  undefined1 local_5290 [8];
  result score_29;
  text local_5260;
  undefined1 local_5240 [8];
  ctx lest__ctx_section_29;
  int lest__count_30;
  int lest__section_30;
  text local_51a0;
  text local_5180;
  allocator<char> local_5159;
  text local_5158;
  allocator<char> local_5131;
  text local_5130;
  location local_5110;
  message local_50e8;
  undefined1 local_5069;
  text local_5068;
  allocator<char> local_5041;
  text local_5040;
  allocator<char> local_5019;
  text local_5018;
  location local_4ff8;
  bool local_4fca;
  expression_decomposer local_4fc9;
  bool *local_4fc8;
  undefined1 local_4fc0 [8];
  result score_28;
  text local_4f90;
  undefined1 local_4f70 [8];
  ctx lest__ctx_section_28;
  int lest__count_29;
  int lest__section_29;
  text local_4ed0;
  text local_4eb0;
  allocator<char> local_4e89;
  text local_4e88;
  allocator<char> local_4e61;
  text local_4e60;
  location local_4e40;
  message local_4e18;
  undefined1 local_4d99;
  text local_4d98;
  allocator<char> local_4d71;
  text local_4d70;
  allocator<char> local_4d49;
  text local_4d48;
  location local_4d28;
  bool local_4cfa;
  expression_decomposer local_4cf9;
  bool *local_4cf8;
  undefined1 local_4cf0 [8];
  result score_27;
  text local_4cc0;
  undefined1 local_4ca0 [8];
  ctx lest__ctx_section_27;
  int lest__count_28;
  int lest__section_28;
  text local_4c00;
  text local_4be0;
  allocator<char> local_4bb9;
  text local_4bb8;
  allocator<char> local_4b91;
  text local_4b90;
  location local_4b70;
  message local_4b48;
  undefined1 local_4ac9;
  text local_4ac8;
  allocator<char> local_4aa1;
  text local_4aa0;
  allocator<char> local_4a79;
  text local_4a78;
  location local_4a58;
  bool local_4a2a;
  expression_decomposer local_4a29;
  bool *local_4a28;
  undefined1 local_4a20 [8];
  result score_26;
  text local_49f0;
  undefined1 local_49d0 [8];
  ctx lest__ctx_section_26;
  int lest__count_27;
  int lest__section_27;
  text local_4930;
  text local_4910;
  allocator<char> local_48e9;
  text local_48e8;
  allocator<char> local_48c1;
  text local_48c0;
  location local_48a0;
  message local_4878;
  undefined1 local_47f9;
  text local_47f8;
  allocator<char> local_47d1;
  text local_47d0;
  allocator<char> local_47a9;
  text local_47a8;
  location local_4788;
  bool local_475a;
  expression_decomposer local_4759;
  bool *local_4758;
  undefined1 local_4750 [8];
  result score_25;
  text local_4720;
  undefined1 local_4700 [8];
  ctx lest__ctx_section_25;
  int lest__count_26;
  int lest__section_26;
  text local_4660;
  text local_4640;
  allocator<char> local_4619;
  text local_4618;
  allocator<char> local_45f1;
  text local_45f0;
  location local_45d0;
  message local_45a8;
  undefined1 local_4529;
  text local_4528;
  allocator<char> local_4501;
  text local_4500;
  allocator<char> local_44d9;
  text local_44d8;
  location local_44b8;
  bool local_448a;
  expression_decomposer local_4489;
  bool *local_4488;
  undefined1 local_4480 [8];
  result score_24;
  text local_4450;
  undefined1 local_4430 [8];
  ctx lest__ctx_section_24;
  int lest__count_25;
  int lest__section_25;
  text local_4390;
  text local_4370;
  allocator<char> local_4349;
  text local_4348;
  allocator<char> local_4321;
  text local_4320;
  location local_4300;
  message local_42d8;
  undefined1 local_4259;
  text local_4258;
  allocator<char> local_4231;
  text local_4230;
  allocator<char> local_4209;
  text local_4208;
  location local_41e8;
  bool local_41ba;
  expression_decomposer local_41b9;
  bool *local_41b8;
  undefined1 local_41b0 [8];
  result score_23;
  text local_4180;
  undefined1 local_4160 [8];
  ctx lest__ctx_section_23;
  int lest__count_24;
  int lest__section_24;
  text local_40c0;
  text local_40a0;
  allocator<char> local_4079;
  text local_4078;
  allocator<char> local_4051;
  text local_4050;
  location local_4030;
  message local_4008;
  undefined1 local_3f89;
  text local_3f88;
  allocator<char> local_3f61;
  text local_3f60;
  allocator<char> local_3f39;
  text local_3f38;
  location local_3f18;
  bool local_3eea;
  expression_decomposer local_3ee9;
  bool *local_3ee8;
  undefined1 local_3ee0 [8];
  result score_22;
  text local_3eb0;
  undefined1 local_3e90 [8];
  ctx lest__ctx_section_22;
  int lest__count_23;
  int lest__section_23;
  text local_3df0;
  text local_3dd0;
  allocator<char> local_3da9;
  text local_3da8;
  allocator<char> local_3d81;
  text local_3d80;
  location local_3d60;
  message local_3d38;
  undefined1 local_3cb9;
  text local_3cb8;
  allocator<char> local_3c91;
  text local_3c90;
  allocator<char> local_3c69;
  text local_3c68;
  location local_3c48;
  bool local_3c1a;
  expression_decomposer local_3c19;
  bool *local_3c18;
  undefined1 local_3c10 [8];
  result score_21;
  text local_3be0;
  undefined1 local_3bc0 [8];
  ctx lest__ctx_section_21;
  int lest__count_22;
  int lest__section_22;
  text local_3b20;
  text local_3b00;
  allocator<char> local_3ad9;
  text local_3ad8;
  allocator<char> local_3ab1;
  text local_3ab0;
  location local_3a90;
  message local_3a68;
  undefined1 local_39e9;
  text local_39e8;
  allocator<char> local_39c1;
  text local_39c0;
  allocator<char> local_3999;
  text local_3998;
  location local_3978;
  bool local_394a;
  expression_decomposer local_3949;
  bool *local_3948;
  undefined1 local_3940 [8];
  result score_20;
  text local_3910;
  undefined1 local_38f0 [8];
  ctx lest__ctx_section_20;
  int lest__count_21;
  int lest__section_21;
  text local_3850;
  text local_3830;
  allocator<char> local_3809;
  text local_3808;
  allocator<char> local_37e1;
  text local_37e0;
  location local_37c0;
  message local_3798;
  undefined1 local_3719;
  text local_3718;
  allocator<char> local_36f1;
  text local_36f0;
  allocator<char> local_36c9;
  text local_36c8;
  location local_36a8;
  bool local_367a;
  expression_decomposer local_3679;
  bool *local_3678;
  undefined1 local_3670 [8];
  result score_19;
  text local_3640;
  undefined1 local_3620 [8];
  ctx lest__ctx_section_19;
  int lest__count_20;
  int lest__section_20;
  text local_3580;
  text local_3560;
  allocator<char> local_3539;
  text local_3538;
  allocator<char> local_3511;
  text local_3510;
  location local_34f0;
  message local_34c8;
  undefined1 local_3449;
  text local_3448;
  allocator<char> local_3421;
  text local_3420;
  allocator<char> local_33f9;
  text local_33f8;
  location local_33d8;
  expression_decomposer local_33a9;
  optional<long> *local_33a8;
  undefined1 local_33a0 [8];
  result score_18;
  text local_3370;
  undefined1 local_3350 [8];
  ctx lest__ctx_section_18;
  int lest__count_19;
  int lest__section_19;
  text local_32b0;
  text local_3290;
  allocator<char> local_3269;
  text local_3268;
  allocator<char> local_3241;
  text local_3240;
  location local_3220;
  message local_31f8;
  undefined1 local_3179;
  text local_3178;
  allocator<char> local_3151;
  text local_3150;
  allocator<char> local_3129;
  text local_3128;
  location local_3108;
  expression_decomposer local_30d9;
  optional<long> *local_30d8;
  undefined1 local_30d0 [8];
  result score_17;
  text local_30a0;
  undefined1 local_3080 [8];
  ctx lest__ctx_section_17;
  int lest__count_18;
  int lest__section_18;
  text local_2fe0;
  text local_2fc0;
  allocator<char> local_2f99;
  text local_2f98;
  allocator<char> local_2f71;
  text local_2f70;
  location local_2f50;
  message local_2f28;
  undefined1 local_2ea9;
  text local_2ea8;
  allocator<char> local_2e81;
  text local_2e80;
  allocator<char> local_2e59;
  text local_2e58;
  location local_2e38;
  expression_decomposer local_2e09;
  optional<int> *local_2e08;
  undefined1 local_2e00 [8];
  result score_16;
  text local_2dd0;
  undefined1 local_2db0 [8];
  ctx lest__ctx_section_16;
  int lest__count_17;
  int lest__section_17;
  text local_2d10;
  text local_2cf0;
  allocator<char> local_2cc9;
  text local_2cc8;
  allocator<char> local_2ca1;
  text local_2ca0;
  location local_2c80;
  message local_2c58;
  undefined1 local_2bd9;
  text local_2bd8;
  allocator<char> local_2bb1;
  text local_2bb0;
  allocator<char> local_2b89;
  text local_2b88;
  location local_2b68;
  bool local_2b3a;
  expression_decomposer local_2b39;
  bool *local_2b38;
  undefined1 local_2b30 [8];
  result score_15;
  text local_2b00;
  undefined1 local_2ae0 [8];
  ctx lest__ctx_section_15;
  int lest__count_16;
  int lest__section_16;
  text local_2a40;
  text local_2a20;
  allocator<char> local_29f9;
  text local_29f8;
  allocator<char> local_29d1;
  text local_29d0;
  location local_29b0;
  message local_2988;
  undefined1 local_2909;
  text local_2908;
  allocator<char> local_28e1;
  text local_28e0;
  allocator<char> local_28b9;
  text local_28b8;
  location local_2898;
  expression_decomposer local_2869;
  optional<long> *local_2868;
  undefined1 local_2860 [8];
  result score_14;
  text local_2830;
  undefined1 local_2810 [8];
  ctx lest__ctx_section_14;
  int lest__count_15;
  int lest__section_15;
  text local_2770;
  text local_2750;
  allocator<char> local_2729;
  text local_2728;
  allocator<char> local_2701;
  text local_2700;
  location local_26e0;
  message local_26b8;
  undefined1 local_2639;
  text local_2638;
  allocator<char> local_2611;
  text local_2610;
  allocator<char> local_25e9;
  text local_25e8;
  location local_25c8;
  expression_decomposer local_2599;
  optional<long> *local_2598;
  undefined1 local_2590 [8];
  result score_13;
  text local_2560;
  undefined1 local_2540 [8];
  ctx lest__ctx_section_13;
  int lest__count_14;
  int lest__section_14;
  text local_24a0;
  text local_2480;
  allocator<char> local_2459;
  text local_2458;
  allocator<char> local_2431;
  text local_2430;
  location local_2410;
  message local_23e8;
  undefined1 local_2369;
  text local_2368;
  allocator<char> local_2341;
  text local_2340;
  allocator<char> local_2319;
  text local_2318;
  location local_22f8;
  expression_decomposer local_22c9;
  optional<char> *local_22c8;
  undefined1 local_22c0 [8];
  result score_12;
  text local_2290;
  undefined1 local_2270 [8];
  ctx lest__ctx_section_12;
  int lest__count_13;
  int lest__section_13;
  text local_21d0;
  text local_21b0;
  allocator<char> local_2189;
  text local_2188;
  allocator<char> local_2161;
  text local_2160;
  location local_2140;
  message local_2118;
  undefined1 local_2099;
  text local_2098;
  allocator<char> local_2071;
  text local_2070;
  allocator<char> local_2049;
  text local_2048;
  location local_2028;
  bool local_1ffa;
  expression_decomposer local_1ff9;
  bool *local_1ff8;
  undefined1 local_1ff0 [8];
  result score_11;
  text local_1fc0;
  undefined1 local_1fa0 [8];
  ctx lest__ctx_section_11;
  int lest__count_12;
  int lest__section_12;
  text local_1f00;
  text local_1ee0;
  allocator<char> local_1eb9;
  text local_1eb8;
  allocator<char> local_1e91;
  text local_1e90;
  location local_1e70;
  message local_1e48;
  undefined1 local_1dc9;
  text local_1dc8;
  allocator<char> local_1da1;
  text local_1da0;
  allocator<char> local_1d79;
  text local_1d78;
  location local_1d58;
  expression_decomposer local_1d29;
  optional<int> *local_1d28;
  undefined1 local_1d20 [8];
  result score_10;
  text local_1cf0;
  undefined1 local_1cd0 [8];
  ctx lest__ctx_section_10;
  int lest__count_11;
  int lest__section_11;
  text local_1c30;
  text local_1c10;
  allocator<char> local_1be9;
  text local_1be8;
  allocator<char> local_1bc1;
  text local_1bc0;
  location local_1ba0;
  message local_1b78;
  undefined1 local_1af9;
  text local_1af8;
  allocator<char> local_1ad1;
  text local_1ad0;
  allocator<char> local_1aa9;
  text local_1aa8;
  location local_1a88;
  expression_decomposer local_1a59;
  optional<int> *local_1a58;
  undefined1 local_1a50 [8];
  result score_9;
  text local_1a20;
  undefined1 local_1a00 [8];
  ctx lest__ctx_section_9;
  int lest__count_10;
  int lest__section_10;
  text local_1960;
  text local_1940;
  allocator<char> local_1919;
  text local_1918;
  allocator<char> local_18f1;
  text local_18f0;
  location local_18d0;
  message local_18a8;
  undefined1 local_1829;
  text local_1828;
  allocator<char> local_1801;
  text local_1800;
  allocator<char> local_17d9;
  text local_17d8;
  location local_17b8;
  expression_decomposer local_1789;
  optional<char> *local_1788;
  undefined1 local_1780 [8];
  result score_8;
  text local_1750;
  undefined1 local_1730 [8];
  ctx lest__ctx_section_8;
  int lest__count_9;
  int lest__section_9;
  text local_1690;
  text local_1670;
  allocator<char> local_1649;
  text local_1648;
  allocator<char> local_1621;
  text local_1620;
  location local_1600;
  message local_15d8;
  undefined1 local_1559;
  text local_1558;
  allocator<char> local_1531;
  text local_1530;
  allocator<char> local_1509;
  text local_1508;
  location local_14e8;
  bool local_14ba;
  expression_decomposer local_14b9;
  bool *local_14b8;
  undefined1 local_14b0 [8];
  result score_7;
  text local_1480;
  undefined1 local_1460 [8];
  ctx lest__ctx_section_7;
  int lest__count_8;
  int lest__section_8;
  text local_13c0;
  text local_13a0;
  allocator<char> local_1379;
  text local_1378;
  allocator<char> local_1351;
  text local_1350;
  location local_1330;
  message local_1308;
  undefined1 local_1289;
  text local_1288;
  allocator<char> local_1261;
  text local_1260;
  allocator<char> local_1239;
  text local_1238;
  location local_1218;
  expression_decomposer local_11e9;
  optional<int> *local_11e8;
  undefined1 local_11e0 [8];
  result score_6;
  text local_11b0;
  undefined1 local_1190 [8];
  ctx lest__ctx_section_6;
  int lest__count_7;
  int lest__section_7;
  text local_10f0;
  text local_10d0;
  allocator<char> local_10a9;
  text local_10a8;
  allocator<char> local_1081;
  text local_1080;
  location local_1060;
  message local_1038;
  undefined1 local_fb9;
  text local_fb8;
  allocator<char> local_f91;
  text local_f90;
  allocator<char> local_f69;
  text local_f68;
  location local_f48;
  expression_decomposer local_f19;
  optional<char> *local_f18;
  undefined1 local_f10 [8];
  result score_5;
  text local_ee0;
  undefined1 local_ec0 [8];
  ctx lest__ctx_section_5;
  int lest__count_6;
  int lest__section_6;
  text local_e20;
  text local_e00;
  allocator<char> local_dd9;
  text local_dd8;
  allocator<char> local_db1;
  text local_db0;
  location local_d90;
  message local_d68;
  undefined1 local_ce9;
  text local_ce8;
  allocator<char> local_cc1;
  text local_cc0;
  allocator<char> local_c99;
  text local_c98;
  location local_c78;
  expression_decomposer local_c49;
  optional<int> *local_c48;
  undefined1 local_c40 [8];
  result score_4;
  text local_c10;
  undefined1 local_bf0 [8];
  ctx lest__ctx_section_4;
  int lest__count_5;
  int lest__section_5;
  text local_b50;
  text local_b30;
  allocator<char> local_b09;
  text local_b08;
  allocator<char> local_ae1;
  text local_ae0;
  location local_ac0;
  message local_a98;
  undefined1 local_a19;
  text local_a18;
  allocator<char> local_9f1;
  text local_9f0;
  allocator<char> local_9c9;
  text local_9c8;
  location local_9a8;
  expression_decomposer local_979;
  optional<int> *local_978;
  undefined1 local_970 [8];
  result score_3;
  text local_940;
  undefined1 local_920 [8];
  ctx lest__ctx_section_3;
  int lest__count_4;
  int lest__section_4;
  text local_880;
  text local_860;
  allocator<char> local_839;
  text local_838;
  allocator<char> local_811;
  text local_810;
  location local_7f0;
  message local_7c8;
  undefined1 local_749;
  text local_748;
  allocator<char> local_721;
  text local_720;
  allocator<char> local_6f9;
  text local_6f8;
  location local_6d8;
  bool local_6aa;
  expression_decomposer local_6a9;
  bool *local_6a8;
  undefined1 local_6a0 [8];
  result score_2;
  text local_670;
  undefined1 local_650 [8];
  ctx lest__ctx_section_2;
  int lest__count_3;
  int lest__section_3;
  text local_5b0;
  text local_590;
  allocator<char> local_569;
  text local_568;
  allocator<char> local_541;
  text local_540;
  location local_520;
  message local_4f8;
  undefined1 local_479;
  text local_478;
  allocator<char> local_451;
  text local_450;
  allocator<char> local_429;
  text local_428;
  location local_408;
  bool local_3da;
  expression_decomposer local_3d9;
  bool *local_3d8;
  undefined1 local_3d0 [8];
  result score_1;
  text local_3a0;
  undefined1 local_380 [8];
  ctx lest__ctx_section_1;
  int lest__count_2;
  int lest__section_2;
  text local_2e0;
  text local_2c0;
  allocator<char> local_299;
  text local_298;
  allocator<char> local_271;
  text local_270;
  location local_250;
  message local_228;
  undefined1 local_1a9;
  text local_1a8;
  allocator<char> local_181;
  text local_180;
  allocator<char> local_159;
  text local_158;
  location local_138;
  expression_decomposer local_109;
  optional<int> *local_108;
  undefined1 local_100 [8];
  result score;
  text local_d0;
  undefined1 local_b0 [8];
  ctx lest__ctx_section;
  int lest__count_1;
  int lest__section_1;
  int local_84;
  undefined1 local_80 [8];
  optional<long> e2;
  optional<int> e1;
  optional<char> d;
  allocator<char> local_49;
  text local_48;
  undefined1 local_28 [8];
  ctx lest__ctx_setup;
  int lest__count;
  int lest__section;
  env *lest_env_local;
  
  lest__ctx_setup._12_4_ = 0;
  lest__ctx_setup.once = true;
  lest__ctx_setup._9_3_ = 0;
  do {
    if ((int)lest__ctx_setup._8_4_ <= (int)lest__ctx_setup._12_4_) {
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
    lest::ctx::ctx((ctx *)local_28,lest_env,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_28), bVar2) {
      std::optional<char>::optional
                ((optional<char> *)
                 ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>._M_payload + 2));
      e2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
      _M_engaged = true;
      e2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_3_
           = 0;
      std::optional<int>::optional<int,_true>
                ((optional<int> *)
                 &e2.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>.field_0xc,
                 (int *)&e2.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_engaged);
      local_84 = 7;
      std::optional<long>::optional<int,_true>((optional<long> *)local_80,&local_84);
      lest::guard::guard((guard *)&lest__count_1,&relop<char,_int,_long>::id395,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_1);
      if (bVar2) {
        lest__ctx_section.once = true;
        lest__ctx_section._9_3_ = 0;
        for (lest__ctx_section._12_4_ = 0;
            (int)lest__ctx_section._12_4_ < (int)lest__ctx_section._8_4_;
            lest__ctx_section._12_4_ = lest__ctx_section._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d0,"engaged    == engaged",
                     (allocator<char> *)(score.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_b0,lest_env,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_b0), bVar2) {
            do {
              local_108 = (optional<int> *)
                          lest::expression_decomposer::operator<<
                                    (&local_109,
                                     (optional<int> *)
                                     &e2.super__Optional_base<long,_true,_true>._M_payload.
                                      super__Optional_payload_base<long>.field_0xc);
              lest::expression_lhs<std::optional<int>const&>::operator==
                        ((result *)local_100,(expression_lhs<std::optional<int>const&> *)&local_108,
                         (optional<int> *)
                         &e2.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>.field_0xc);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_100);
              if (bVar2) {
                local_1a9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_158,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_159);
                lest::location::location(&local_138,&local_158,0x18b);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_180,"e1 == e1",&local_181);
                std::__cxx11::string::string((string *)&local_1a8,(string *)&score);
                lest::failure::failure(pfVar9,&local_138,&local_180,&local_1a8);
                local_1a9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_270,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_271);
                lest::location::location(&local_250,&local_270,0x18b);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_298,"e1 == e1",&local_299);
                std::__cxx11::string::string((string *)&local_2c0,(string *)&score);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_228,&local_250,&local_298,&local_2c0,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_2e0,lest_env);
                lest::report(poVar1,&local_228,&local_2e0);
                std::__cxx11::string::~string((string *)&local_2e0);
                lest::passing::~passing((passing *)&local_228);
                std::__cxx11::string::~string((string *)&local_2c0);
                std::__cxx11::string::~string((string *)&local_298);
                std::allocator<char>::~allocator(&local_299);
                lest::location::~location(&local_250);
                std::__cxx11::string::~string((string *)&local_270);
                std::allocator<char>::~allocator(&local_271);
              }
              lest::result::~result((result *)local_100);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_b0);
          lest__ctx_section._8_4_ = lest__ctx_section._8_4_ - (uint)(lest__ctx_section._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_2,&relop<char,_int,_long>::id396,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_2);
      if (bVar2) {
        lest__ctx_section_1.once = true;
        lest__ctx_section_1._9_3_ = 0;
        for (lest__ctx_section_1._12_4_ = 0;
            (int)lest__ctx_section_1._12_4_ < (int)lest__ctx_section_1._8_4_;
            lest__ctx_section_1._12_4_ = lest__ctx_section_1._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a0,"engaged    == disengaged",
                     (allocator<char> *)(score_1.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_380,lest_env,&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_1.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_380), bVar2) {
            do {
              _Var3 = std::operator==((optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc,
                                      (optional<char> *)
                                      ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                              super__Optional_payload_base<int>._M_payload + 2));
              local_3da = (bool)(~_Var3 & 1);
              local_3d8 = (bool *)lest::expression_decomposer::operator<<(&local_3d9,&local_3da);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3d0,(expression_lhs *)&local_3d8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3d0);
              if (bVar2) {
                local_479 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_428,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_429);
                lest::location::location(&local_408,&local_428,0x18c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_450,"!(e1 == d )",&local_451);
                std::__cxx11::string::string((string *)&local_478,(string *)&score_1);
                lest::failure::failure(pfVar9,&local_408,&local_450,&local_478);
                local_479 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_540,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_541);
                lest::location::location(&local_520,&local_540,0x18c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_568,"!(e1 == d )",&local_569);
                std::__cxx11::string::string((string *)&local_590,(string *)&score_1);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_4f8,&local_520,&local_568,&local_590,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_5b0,lest_env);
                lest::report(poVar1,&local_4f8,&local_5b0);
                std::__cxx11::string::~string((string *)&local_5b0);
                lest::passing::~passing((passing *)&local_4f8);
                std::__cxx11::string::~string((string *)&local_590);
                std::__cxx11::string::~string((string *)&local_568);
                std::allocator<char>::~allocator(&local_569);
                lest::location::~location(&local_520);
                std::__cxx11::string::~string((string *)&local_540);
                std::allocator<char>::~allocator(&local_541);
              }
              lest::result::~result((result *)local_3d0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_380);
          lest__ctx_section_1._8_4_ =
               lest__ctx_section_1._8_4_ - (uint)(lest__ctx_section_1._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_3,&relop<char,_int,_long>::id397,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_3);
      if (bVar2) {
        lest__ctx_section_2.once = true;
        lest__ctx_section_2._9_3_ = 0;
        for (lest__ctx_section_2._12_4_ = 0;
            (int)lest__ctx_section_2._12_4_ < (int)lest__ctx_section_2._8_4_;
            lest__ctx_section_2._12_4_ = lest__ctx_section_2._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_670,"disengaged == engaged",
                     (allocator<char> *)(score_2.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_650,lest_env,&local_670);
          std::__cxx11::string::~string((string *)&local_670);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_2.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_650), bVar2) {
            do {
              _Var4 = std::operator==((optional<char> *)
                                      ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                              super__Optional_payload_base<int>._M_payload + 2),
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              local_6aa = (bool)(~_Var4 & 1);
              local_6a8 = (bool *)lest::expression_decomposer::operator<<(&local_6a9,&local_6aa);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_6a0,(expression_lhs *)&local_6a8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6a0);
              if (bVar2) {
                local_749 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_6f9);
                lest::location::location(&local_6d8,&local_6f8,0x18d);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_720,"!(d == e1)",&local_721);
                std::__cxx11::string::string((string *)&local_748,(string *)&score_2);
                lest::failure::failure(pfVar9,&local_6d8,&local_720,&local_748);
                local_749 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_810,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_811);
                lest::location::location(&local_7f0,&local_810,0x18d);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_838,"!(d == e1)",&local_839);
                std::__cxx11::string::string((string *)&local_860,(string *)&score_2);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_7c8,&local_7f0,&local_838,&local_860,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_880,lest_env);
                lest::report(poVar1,&local_7c8,&local_880);
                std::__cxx11::string::~string((string *)&local_880);
                lest::passing::~passing((passing *)&local_7c8);
                std::__cxx11::string::~string((string *)&local_860);
                std::__cxx11::string::~string((string *)&local_838);
                std::allocator<char>::~allocator(&local_839);
                lest::location::~location(&local_7f0);
                std::__cxx11::string::~string((string *)&local_810);
                std::allocator<char>::~allocator(&local_811);
              }
              lest::result::~result((result *)local_6a0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_650);
          lest__ctx_section_2._8_4_ =
               lest__ctx_section_2._8_4_ - (uint)(lest__ctx_section_2._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_4,&relop<char,_int,_long>::id399,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_4);
      if (bVar2) {
        lest__ctx_section_3.once = true;
        lest__ctx_section_3._9_3_ = 0;
        for (lest__ctx_section_3._12_4_ = 0;
            (int)lest__ctx_section_3._12_4_ < (int)lest__ctx_section_3._8_4_;
            lest__ctx_section_3._12_4_ = lest__ctx_section_3._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_940,"engaged    != engaged",
                     (allocator<char> *)(score_3.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_920,lest_env,&local_940);
          std::__cxx11::string::~string((string *)&local_940);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_3.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_920), bVar2) {
            do {
              local_978 = (optional<int> *)
                          lest::expression_decomposer::operator<<
                                    (&local_979,
                                     (optional<int> *)
                                     &e2.super__Optional_base<long,_true,_true>._M_payload.
                                      super__Optional_payload_base<long>.field_0xc);
              lest::expression_lhs<std::optional<int>const&>::operator!=
                        ((result *)local_970,(expression_lhs<std::optional<int>const&> *)&local_978,
                         (optional<long> *)local_80);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_970);
              if (bVar2) {
                local_a19 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_9c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_9c9);
                lest::location::location(&local_9a8,&local_9c8,399);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_9f0,"e1 != e2",&local_9f1);
                std::__cxx11::string::string((string *)&local_a18,(string *)&score_3);
                lest::failure::failure(pfVar9,&local_9a8,&local_9f0,&local_a18);
                local_a19 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_ae0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_ae1);
                lest::location::location(&local_ac0,&local_ae0,399);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_b08,"e1 != e2",&local_b09);
                std::__cxx11::string::string((string *)&local_b30,(string *)&score_3);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_a98,&local_ac0,&local_b08,&local_b30,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_b50,lest_env);
                lest::report(poVar1,&local_a98,&local_b50);
                std::__cxx11::string::~string((string *)&local_b50);
                lest::passing::~passing((passing *)&local_a98);
                std::__cxx11::string::~string((string *)&local_b30);
                std::__cxx11::string::~string((string *)&local_b08);
                std::allocator<char>::~allocator(&local_b09);
                lest::location::~location(&local_ac0);
                std::__cxx11::string::~string((string *)&local_ae0);
                std::allocator<char>::~allocator(&local_ae1);
              }
              lest::result::~result((result *)local_970);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_920);
          lest__ctx_section_3._8_4_ =
               lest__ctx_section_3._8_4_ - (uint)(lest__ctx_section_3._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_5,&relop<char,_int,_long>::id400,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_5);
      if (bVar2) {
        lest__ctx_section_4.once = true;
        lest__ctx_section_4._9_3_ = 0;
        for (lest__ctx_section_4._12_4_ = 0;
            (int)lest__ctx_section_4._12_4_ < (int)lest__ctx_section_4._8_4_;
            lest__ctx_section_4._12_4_ = lest__ctx_section_4._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c10,"engaged    != disengaged",
                     (allocator<char> *)(score_4.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_bf0,lest_env,&local_c10);
          std::__cxx11::string::~string((string *)&local_c10);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_4.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_bf0), bVar2) {
            do {
              local_c48 = (optional<int> *)
                          lest::expression_decomposer::operator<<
                                    (&local_c49,
                                     (optional<int> *)
                                     &e2.super__Optional_base<long,_true,_true>._M_payload.
                                      super__Optional_payload_base<long>.field_0xc);
              lest::expression_lhs<std::optional<int>const&>::operator!=
                        ((result *)local_c40,(expression_lhs<std::optional<int>const&> *)&local_c48,
                         (optional<char> *)
                         ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int>._M_payload + 2));
              bVar2 = lest::result::operator_cast_to_bool((result *)local_c40);
              if (bVar2) {
                local_ce9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_c98,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_c99);
                lest::location::location(&local_c78,&local_c98,400);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_cc0,"e1 != d",&local_cc1);
                std::__cxx11::string::string((string *)&local_ce8,(string *)&score_4);
                lest::failure::failure(pfVar9,&local_c78,&local_cc0,&local_ce8);
                local_ce9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_db0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_db1);
                lest::location::location(&local_d90,&local_db0,400);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_dd8,"e1 != d",&local_dd9);
                std::__cxx11::string::string((string *)&local_e00,(string *)&score_4);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing((passing *)&local_d68,&local_d90,&local_dd8,&local_e00,bVar2)
                ;
                lest::env::context_abi_cxx11_(&local_e20,lest_env);
                lest::report(poVar1,&local_d68,&local_e20);
                std::__cxx11::string::~string((string *)&local_e20);
                lest::passing::~passing((passing *)&local_d68);
                std::__cxx11::string::~string((string *)&local_e00);
                std::__cxx11::string::~string((string *)&local_dd8);
                std::allocator<char>::~allocator(&local_dd9);
                lest::location::~location(&local_d90);
                std::__cxx11::string::~string((string *)&local_db0);
                std::allocator<char>::~allocator(&local_db1);
              }
              lest::result::~result((result *)local_c40);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_bf0);
          lest__ctx_section_4._8_4_ =
               lest__ctx_section_4._8_4_ - (uint)(lest__ctx_section_4._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_6,&relop<char,_int,_long>::id401,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_6);
      if (bVar2) {
        lest__ctx_section_5.once = true;
        lest__ctx_section_5._9_3_ = 0;
        for (lest__ctx_section_5._12_4_ = 0;
            (int)lest__ctx_section_5._12_4_ < (int)lest__ctx_section_5._8_4_;
            lest__ctx_section_5._12_4_ = lest__ctx_section_5._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ee0,"disengaged != engaged",
                     (allocator<char> *)(score_5.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_ec0,lest_env,&local_ee0);
          std::__cxx11::string::~string((string *)&local_ee0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_5.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_ec0), bVar2) {
            do {
              local_f18 = (optional<char> *)
                          lest::expression_decomposer::operator<<
                                    (&local_f19,
                                     (optional<char> *)
                                     ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                             super__Optional_payload_base<int>._M_payload + 2));
              lest::expression_lhs<std::optional<char>const&>::operator!=
                        ((result *)local_f10,(expression_lhs<std::optional<char>const&> *)&local_f18
                         ,(optional<long> *)local_80);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_f10);
              if (bVar2) {
                local_fb9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f68,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_f69);
                lest::location::location(&local_f48,&local_f68,0x191);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_f90,"d != e2",&local_f91);
                std::__cxx11::string::string((string *)&local_fb8,(string *)&score_5);
                lest::failure::failure(pfVar9,&local_f48,&local_f90,&local_fb8);
                local_fb9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1080,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_1081);
                lest::location::location(&local_1060,&local_1080,0x191);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_10a8,"d != e2",&local_10a9);
                std::__cxx11::string::string((string *)&local_10d0,(string *)&score_5);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1038,&local_1060,&local_10a8,&local_10d0,bVar2);
                lest::env::context_abi_cxx11_(&local_10f0,lest_env);
                lest::report(poVar1,&local_1038,&local_10f0);
                std::__cxx11::string::~string((string *)&local_10f0);
                lest::passing::~passing((passing *)&local_1038);
                std::__cxx11::string::~string((string *)&local_10d0);
                std::__cxx11::string::~string((string *)&local_10a8);
                std::allocator<char>::~allocator(&local_10a9);
                lest::location::~location(&local_1060);
                std::__cxx11::string::~string((string *)&local_1080);
                std::allocator<char>::~allocator(&local_1081);
              }
              lest::result::~result((result *)local_f10);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_ec0);
          lest__ctx_section_5._8_4_ =
               lest__ctx_section_5._8_4_ - (uint)(lest__ctx_section_5._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_7,&relop<char,_int,_long>::id403,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_7);
      if (bVar2) {
        lest__ctx_section_6.once = true;
        lest__ctx_section_6._9_3_ = 0;
        for (lest__ctx_section_6._12_4_ = 0;
            (int)lest__ctx_section_6._12_4_ < (int)lest__ctx_section_6._8_4_;
            lest__ctx_section_6._12_4_ = lest__ctx_section_6._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_11b0,"engaged    <  engaged",
                     (allocator<char> *)(score_6.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1190,lest_env,&local_11b0);
          std::__cxx11::string::~string((string *)&local_11b0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_6.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1190), bVar2) {
            do {
              local_11e8 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_11e9,
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              lest::expression_lhs<std::optional<int>const&>::operator<
                        ((result *)local_11e0,
                         (expression_lhs<std::optional<int>const&> *)&local_11e8,
                         (optional<long> *)local_80);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_11e0);
              if (bVar2) {
                local_1289 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1238,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_1239);
                lest::location::location(&local_1218,&local_1238,0x193);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1260,"e1 < e2",&local_1261);
                std::__cxx11::string::string((string *)&local_1288,(string *)&score_6);
                lest::failure::failure(pfVar9,&local_1218,&local_1260,&local_1288);
                local_1289 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1350,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_1351);
                lest::location::location(&local_1330,&local_1350,0x193);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1378,"e1 < e2",&local_1379);
                std::__cxx11::string::string((string *)&local_13a0,(string *)&score_6);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1308,&local_1330,&local_1378,&local_13a0,bVar2);
                lest::env::context_abi_cxx11_(&local_13c0,lest_env);
                lest::report(poVar1,&local_1308,&local_13c0);
                std::__cxx11::string::~string((string *)&local_13c0);
                lest::passing::~passing((passing *)&local_1308);
                std::__cxx11::string::~string((string *)&local_13a0);
                std::__cxx11::string::~string((string *)&local_1378);
                std::allocator<char>::~allocator(&local_1379);
                lest::location::~location(&local_1330);
                std::__cxx11::string::~string((string *)&local_1350);
                std::allocator<char>::~allocator(&local_1351);
              }
              lest::result::~result((result *)local_11e0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_1190);
          lest__ctx_section_6._8_4_ =
               lest__ctx_section_6._8_4_ - (uint)(lest__ctx_section_6._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_8,&relop<char,_int,_long>::id404,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_8);
      if (bVar2) {
        lest__ctx_section_7.once = true;
        lest__ctx_section_7._9_3_ = 0;
        for (lest__ctx_section_7._12_4_ = 0;
            (int)lest__ctx_section_7._12_4_ < (int)lest__ctx_section_7._8_4_;
            lest__ctx_section_7._12_4_ = lest__ctx_section_7._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1480,"engaged    <  disengaged",
                     (allocator<char> *)(score_7.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1460,lest_env,&local_1480);
          std::__cxx11::string::~string((string *)&local_1480);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_7.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1460), bVar2) {
            do {
              _Var5 = std::enable_if<is_convertible<decltype(((std::declval<int_const&>)())<((std::
                      declval<char_const&>)())),bool>::value,bool>::type_std::operator<
                                ((optional<int> *)
                                 &e2.super__Optional_base<long,_true,_true>._M_payload.
                                  super__Optional_payload_base<long>.field_0xc,
                                 (optional<char> *)
                                 ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                         super__Optional_payload_base<int>._M_payload + 2));
              local_14ba = (bool)(~_Var5 & 1);
              local_14b8 = (bool *)lest::expression_decomposer::operator<<(&local_14b9,&local_14ba);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_14b0,(expression_lhs *)&local_14b8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_14b0);
              if (bVar2) {
                local_1559 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1508,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_1509);
                lest::location::location(&local_14e8,&local_1508,0x194);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1530,"!(e1 < d )",&local_1531);
                std::__cxx11::string::string((string *)&local_1558,(string *)&score_7);
                lest::failure::failure(pfVar9,&local_14e8,&local_1530,&local_1558);
                local_1559 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1620,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_1621);
                lest::location::location(&local_1600,&local_1620,0x194);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1648,"!(e1 < d )",&local_1649);
                std::__cxx11::string::string((string *)&local_1670,(string *)&score_7);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_15d8,&local_1600,&local_1648,&local_1670,bVar2);
                lest::env::context_abi_cxx11_(&local_1690,lest_env);
                lest::report(poVar1,&local_15d8,&local_1690);
                std::__cxx11::string::~string((string *)&local_1690);
                lest::passing::~passing((passing *)&local_15d8);
                std::__cxx11::string::~string((string *)&local_1670);
                std::__cxx11::string::~string((string *)&local_1648);
                std::allocator<char>::~allocator(&local_1649);
                lest::location::~location(&local_1600);
                std::__cxx11::string::~string((string *)&local_1620);
                std::allocator<char>::~allocator(&local_1621);
              }
              lest::result::~result((result *)local_14b0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_1460);
          lest__ctx_section_7._8_4_ =
               lest__ctx_section_7._8_4_ - (uint)(lest__ctx_section_7._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_9,&relop<char,_int,_long>::id405,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_9);
      if (bVar2) {
        lest__ctx_section_8.once = true;
        lest__ctx_section_8._9_3_ = 0;
        for (lest__ctx_section_8._12_4_ = 0;
            (int)lest__ctx_section_8._12_4_ < (int)lest__ctx_section_8._8_4_;
            lest__ctx_section_8._12_4_ = lest__ctx_section_8._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1750,"disengaged <  engaged",
                     (allocator<char> *)(score_8.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1730,lest_env,&local_1750);
          std::__cxx11::string::~string((string *)&local_1750);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_8.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1730), bVar2) {
            do {
              local_1788 = (optional<char> *)
                           lest::expression_decomposer::operator<<
                                     (&local_1789,
                                      (optional<char> *)
                                      ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                              super__Optional_payload_base<int>._M_payload + 2));
              lest::expression_lhs<std::optional<char>const&>::operator<
                        ((result *)local_1780,
                         (expression_lhs<std::optional<char>const&> *)&local_1788,
                         (optional<long> *)local_80);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_1780);
              if (bVar2) {
                local_1829 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_17d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_17d9);
                lest::location::location(&local_17b8,&local_17d8,0x195);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1800,"d < e2",&local_1801);
                std::__cxx11::string::string((string *)&local_1828,(string *)&score_8);
                lest::failure::failure(pfVar9,&local_17b8,&local_1800,&local_1828);
                local_1829 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_18f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_18f1);
                lest::location::location(&local_18d0,&local_18f0,0x195);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1918,"d < e2",&local_1919);
                std::__cxx11::string::string((string *)&local_1940,(string *)&score_8);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_18a8,&local_18d0,&local_1918,&local_1940,bVar2);
                lest::env::context_abi_cxx11_(&local_1960,lest_env);
                lest::report(poVar1,&local_18a8,&local_1960);
                std::__cxx11::string::~string((string *)&local_1960);
                lest::passing::~passing((passing *)&local_18a8);
                std::__cxx11::string::~string((string *)&local_1940);
                std::__cxx11::string::~string((string *)&local_1918);
                std::allocator<char>::~allocator(&local_1919);
                lest::location::~location(&local_18d0);
                std::__cxx11::string::~string((string *)&local_18f0);
                std::allocator<char>::~allocator(&local_18f1);
              }
              lest::result::~result((result *)local_1780);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_1730);
          lest__ctx_section_8._8_4_ =
               lest__ctx_section_8._8_4_ - (uint)(lest__ctx_section_8._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_10,&relop<char,_int,_long>::id407,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_10);
      if (bVar2) {
        lest__ctx_section_9.once = true;
        lest__ctx_section_9._9_3_ = 0;
        for (lest__ctx_section_9._12_4_ = 0;
            (int)lest__ctx_section_9._12_4_ < (int)lest__ctx_section_9._8_4_;
            lest__ctx_section_9._12_4_ = lest__ctx_section_9._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a20,"engaged    <= engaged",
                     (allocator<char> *)(score_9.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1a00,lest_env,&local_1a20);
          std::__cxx11::string::~string((string *)&local_1a20);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_9.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1a00), bVar2) {
            do {
              local_1a58 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_1a59,
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              lest::expression_lhs<std::optional<int>const&>::operator<=
                        ((result *)local_1a50,
                         (expression_lhs<std::optional<int>const&> *)&local_1a58,
                         (optional<int> *)
                         &e2.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>.field_0xc);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_1a50);
              if (bVar2) {
                local_1af9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1aa8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_1aa9);
                lest::location::location(&local_1a88,&local_1aa8,0x197);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1ad0,"e1 <= e1",&local_1ad1);
                std::__cxx11::string::string((string *)&local_1af8,(string *)&score_9);
                lest::failure::failure(pfVar9,&local_1a88,&local_1ad0,&local_1af8);
                local_1af9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1bc0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_1bc1);
                lest::location::location(&local_1ba0,&local_1bc0,0x197);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1be8,"e1 <= e1",&local_1be9);
                std::__cxx11::string::string((string *)&local_1c10,(string *)&score_9);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1b78,&local_1ba0,&local_1be8,&local_1c10,bVar2);
                lest::env::context_abi_cxx11_(&local_1c30,lest_env);
                lest::report(poVar1,&local_1b78,&local_1c30);
                std::__cxx11::string::~string((string *)&local_1c30);
                lest::passing::~passing((passing *)&local_1b78);
                std::__cxx11::string::~string((string *)&local_1c10);
                std::__cxx11::string::~string((string *)&local_1be8);
                std::allocator<char>::~allocator(&local_1be9);
                lest::location::~location(&local_1ba0);
                std::__cxx11::string::~string((string *)&local_1bc0);
                std::allocator<char>::~allocator(&local_1bc1);
              }
              lest::result::~result((result *)local_1a50);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_1a00);
          lest__ctx_section_9._8_4_ =
               lest__ctx_section_9._8_4_ - (uint)(lest__ctx_section_9._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_11,&relop<char,_int,_long>::id408,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_11);
      if (bVar2) {
        lest__ctx_section_10.once = true;
        lest__ctx_section_10._9_3_ = 0;
        for (lest__ctx_section_10._12_4_ = 0;
            (int)lest__ctx_section_10._12_4_ < (int)lest__ctx_section_10._8_4_;
            lest__ctx_section_10._12_4_ = lest__ctx_section_10._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1cf0,"engaged    <= engaged",
                     (allocator<char> *)(score_10.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1cd0,lest_env,&local_1cf0);
          std::__cxx11::string::~string((string *)&local_1cf0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_10.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1cd0), bVar2) {
            do {
              local_1d28 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_1d29,
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              lest::expression_lhs<std::optional<int>const&>::operator<=
                        ((result *)local_1d20,
                         (expression_lhs<std::optional<int>const&> *)&local_1d28,
                         (optional<long> *)local_80);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_1d20);
              if (bVar2) {
                local_1dc9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1d78,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_1d79);
                lest::location::location(&local_1d58,&local_1d78,0x198);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1da0,"e1 <= e2",&local_1da1);
                std::__cxx11::string::string((string *)&local_1dc8,(string *)&score_10);
                lest::failure::failure(pfVar9,&local_1d58,&local_1da0,&local_1dc8);
                local_1dc9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1e90,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_1e91);
                lest::location::location(&local_1e70,&local_1e90,0x198);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1eb8,"e1 <= e2",&local_1eb9);
                std::__cxx11::string::string((string *)&local_1ee0,(string *)&score_10);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1e48,&local_1e70,&local_1eb8,&local_1ee0,bVar2);
                lest::env::context_abi_cxx11_(&local_1f00,lest_env);
                lest::report(poVar1,&local_1e48,&local_1f00);
                std::__cxx11::string::~string((string *)&local_1f00);
                lest::passing::~passing((passing *)&local_1e48);
                std::__cxx11::string::~string((string *)&local_1ee0);
                std::__cxx11::string::~string((string *)&local_1eb8);
                std::allocator<char>::~allocator(&local_1eb9);
                lest::location::~location(&local_1e70);
                std::__cxx11::string::~string((string *)&local_1e90);
                std::allocator<char>::~allocator(&local_1e91);
              }
              lest::result::~result((result *)local_1d20);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_1cd0);
          lest__ctx_section_10._8_4_ =
               lest__ctx_section_10._8_4_ - (uint)(lest__ctx_section_10._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_12,&relop<char,_int,_long>::id409,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_12);
      if (bVar2) {
        lest__ctx_section_11.once = true;
        lest__ctx_section_11._9_3_ = 0;
        for (lest__ctx_section_11._12_4_ = 0;
            (int)lest__ctx_section_11._12_4_ < (int)lest__ctx_section_11._8_4_;
            lest__ctx_section_11._12_4_ = lest__ctx_section_11._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1fc0,"engaged    <= disengaged",
                     (allocator<char> *)(score_11.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_1fa0,lest_env,&local_1fc0);
          std::__cxx11::string::~string((string *)&local_1fc0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_11.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1fa0), bVar2) {
            do {
              _Var6 = std::enable_if<is_convertible<decltype(((std::declval<int_const&>)())<=((std::
                      declval<char_const&>)())),bool>::value,bool>::type_std::operator<=
                                ((optional<int> *)
                                 &e2.super__Optional_base<long,_true,_true>._M_payload.
                                  super__Optional_payload_base<long>.field_0xc,
                                 (optional<char> *)
                                 ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                         super__Optional_payload_base<int>._M_payload + 2));
              local_1ffa = (bool)(~_Var6 & 1);
              local_1ff8 = (bool *)lest::expression_decomposer::operator<<(&local_1ff9,&local_1ffa);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_1ff0,(expression_lhs *)&local_1ff8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_1ff0);
              if (bVar2) {
                local_2099 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2048,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_2049);
                lest::location::location(&local_2028,&local_2048,0x199);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2070,"!(e1 <= d )",&local_2071);
                std::__cxx11::string::string((string *)&local_2098,(string *)&score_11);
                lest::failure::failure(pfVar9,&local_2028,&local_2070,&local_2098);
                local_2099 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2160,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_2161);
                lest::location::location(&local_2140,&local_2160,0x199);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2188,"!(e1 <= d )",&local_2189);
                std::__cxx11::string::string((string *)&local_21b0,(string *)&score_11);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2118,&local_2140,&local_2188,&local_21b0,bVar2);
                lest::env::context_abi_cxx11_(&local_21d0,lest_env);
                lest::report(poVar1,&local_2118,&local_21d0);
                std::__cxx11::string::~string((string *)&local_21d0);
                lest::passing::~passing((passing *)&local_2118);
                std::__cxx11::string::~string((string *)&local_21b0);
                std::__cxx11::string::~string((string *)&local_2188);
                std::allocator<char>::~allocator(&local_2189);
                lest::location::~location(&local_2140);
                std::__cxx11::string::~string((string *)&local_2160);
                std::allocator<char>::~allocator(&local_2161);
              }
              lest::result::~result((result *)local_1ff0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_1fa0);
          lest__ctx_section_11._8_4_ =
               lest__ctx_section_11._8_4_ - (uint)(lest__ctx_section_11._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_13,&relop<char,_int,_long>::id410,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_13);
      if (bVar2) {
        lest__ctx_section_12.once = true;
        lest__ctx_section_12._9_3_ = 0;
        for (lest__ctx_section_12._12_4_ = 0;
            (int)lest__ctx_section_12._12_4_ < (int)lest__ctx_section_12._8_4_;
            lest__ctx_section_12._12_4_ = lest__ctx_section_12._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2290,"disengaged <= engaged",
                     (allocator<char> *)(score_12.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2270,lest_env,&local_2290);
          std::__cxx11::string::~string((string *)&local_2290);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_12.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2270), bVar2) {
            do {
              local_22c8 = (optional<char> *)
                           lest::expression_decomposer::operator<<
                                     (&local_22c9,
                                      (optional<char> *)
                                      ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                              super__Optional_payload_base<int>._M_payload + 2));
              lest::expression_lhs<std::optional<char>const&>::operator<=
                        ((result *)local_22c0,
                         (expression_lhs<std::optional<char>const&> *)&local_22c8,
                         (optional<long> *)local_80);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_22c0);
              if (bVar2) {
                local_2369 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2318,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_2319);
                lest::location::location(&local_22f8,&local_2318,0x19a);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2340,"d <= e2",&local_2341);
                std::__cxx11::string::string((string *)&local_2368,(string *)&score_12);
                lest::failure::failure(pfVar9,&local_22f8,&local_2340,&local_2368);
                local_2369 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2430,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_2431);
                lest::location::location(&local_2410,&local_2430,0x19a);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2458,"d <= e2",&local_2459);
                std::__cxx11::string::string((string *)&local_2480,(string *)&score_12);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_23e8,&local_2410,&local_2458,&local_2480,bVar2);
                lest::env::context_abi_cxx11_(&local_24a0,lest_env);
                lest::report(poVar1,&local_23e8,&local_24a0);
                std::__cxx11::string::~string((string *)&local_24a0);
                lest::passing::~passing((passing *)&local_23e8);
                std::__cxx11::string::~string((string *)&local_2480);
                std::__cxx11::string::~string((string *)&local_2458);
                std::allocator<char>::~allocator(&local_2459);
                lest::location::~location(&local_2410);
                std::__cxx11::string::~string((string *)&local_2430);
                std::allocator<char>::~allocator(&local_2431);
              }
              lest::result::~result((result *)local_22c0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_2270);
          lest__ctx_section_12._8_4_ =
               lest__ctx_section_12._8_4_ - (uint)(lest__ctx_section_12._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_14,&relop<char,_int,_long>::id412,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_14);
      if (bVar2) {
        lest__ctx_section_13.once = true;
        lest__ctx_section_13._9_3_ = 0;
        for (lest__ctx_section_13._12_4_ = 0;
            (int)lest__ctx_section_13._12_4_ < (int)lest__ctx_section_13._8_4_;
            lest__ctx_section_13._12_4_ = lest__ctx_section_13._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2560,"engaged    >  engaged",
                     (allocator<char> *)(score_13.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2540,lest_env,&local_2560);
          std::__cxx11::string::~string((string *)&local_2560);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_13.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2540), bVar2) {
            do {
              local_2598 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_2599,(optional<long> *)local_80);
              lest::expression_lhs<std::optional<long>const&>::operator>
                        ((result *)local_2590,
                         (expression_lhs<std::optional<long>const&> *)&local_2598,
                         (optional<int> *)
                         &e2.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>.field_0xc);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2590);
              if (bVar2) {
                local_2639 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_25e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_25e9);
                lest::location::location(&local_25c8,&local_25e8,0x19c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2610,"e2 > e1",&local_2611);
                std::__cxx11::string::string((string *)&local_2638,(string *)&score_13);
                lest::failure::failure(pfVar9,&local_25c8,&local_2610,&local_2638);
                local_2639 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2700,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_2701);
                lest::location::location(&local_26e0,&local_2700,0x19c);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2728,"e2 > e1",&local_2729);
                std::__cxx11::string::string((string *)&local_2750,(string *)&score_13);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_26b8,&local_26e0,&local_2728,&local_2750,bVar2);
                lest::env::context_abi_cxx11_(&local_2770,lest_env);
                lest::report(poVar1,&local_26b8,&local_2770);
                std::__cxx11::string::~string((string *)&local_2770);
                lest::passing::~passing((passing *)&local_26b8);
                std::__cxx11::string::~string((string *)&local_2750);
                std::__cxx11::string::~string((string *)&local_2728);
                std::allocator<char>::~allocator(&local_2729);
                lest::location::~location(&local_26e0);
                std::__cxx11::string::~string((string *)&local_2700);
                std::allocator<char>::~allocator(&local_2701);
              }
              lest::result::~result((result *)local_2590);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_2540);
          lest__ctx_section_13._8_4_ =
               lest__ctx_section_13._8_4_ - (uint)(lest__ctx_section_13._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_15,&relop<char,_int,_long>::id413,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_15);
      if (bVar2) {
        lest__ctx_section_14.once = true;
        lest__ctx_section_14._9_3_ = 0;
        for (lest__ctx_section_14._12_4_ = 0;
            (int)lest__ctx_section_14._12_4_ < (int)lest__ctx_section_14._8_4_;
            lest__ctx_section_14._12_4_ = lest__ctx_section_14._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2830,"engaged    >  disengaged",
                     (allocator<char> *)(score_14.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2810,lest_env,&local_2830);
          std::__cxx11::string::~string((string *)&local_2830);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_14.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2810), bVar2) {
            do {
              local_2868 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_2869,(optional<long> *)local_80);
              lest::expression_lhs<std::optional<long>const&>::operator>
                        ((result *)local_2860,
                         (expression_lhs<std::optional<long>const&> *)&local_2868,
                         (optional<char> *)
                         ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int>._M_payload + 2));
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2860);
              if (bVar2) {
                local_2909 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_28b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_28b9);
                lest::location::location(&local_2898,&local_28b8,0x19d);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_28e0,"e2 > d",&local_28e1);
                std::__cxx11::string::string((string *)&local_2908,(string *)&score_14);
                lest::failure::failure(pfVar9,&local_2898,&local_28e0,&local_2908);
                local_2909 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_29d0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_29d1);
                lest::location::location(&local_29b0,&local_29d0,0x19d);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_29f8,"e2 > d",&local_29f9);
                std::__cxx11::string::string((string *)&local_2a20,(string *)&score_14);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2988,&local_29b0,&local_29f8,&local_2a20,bVar2);
                lest::env::context_abi_cxx11_(&local_2a40,lest_env);
                lest::report(poVar1,&local_2988,&local_2a40);
                std::__cxx11::string::~string((string *)&local_2a40);
                lest::passing::~passing((passing *)&local_2988);
                std::__cxx11::string::~string((string *)&local_2a20);
                std::__cxx11::string::~string((string *)&local_29f8);
                std::allocator<char>::~allocator(&local_29f9);
                lest::location::~location(&local_29b0);
                std::__cxx11::string::~string((string *)&local_29d0);
                std::allocator<char>::~allocator(&local_29d1);
              }
              lest::result::~result((result *)local_2860);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_2810);
          lest__ctx_section_14._8_4_ =
               lest__ctx_section_14._8_4_ - (uint)(lest__ctx_section_14._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_16,&relop<char,_int,_long>::id414,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_16);
      if (bVar2) {
        lest__ctx_section_15.once = true;
        lest__ctx_section_15._9_3_ = 0;
        for (lest__ctx_section_15._12_4_ = 0;
            (int)lest__ctx_section_15._12_4_ < (int)lest__ctx_section_15._8_4_;
            lest__ctx_section_15._12_4_ = lest__ctx_section_15._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b00,"disengaged >  engaged",
                     (allocator<char> *)(score_15.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2ae0,lest_env,&local_2b00);
          std::__cxx11::string::~string((string *)&local_2b00);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_15.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2ae0), bVar2) {
            do {
              _Var7 = std::operator>((optional<char> *)
                                     ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                             super__Optional_payload_base<int>._M_payload + 2),
                                     (optional<int> *)
                                     &e2.super__Optional_base<long,_true,_true>._M_payload.
                                      super__Optional_payload_base<long>.field_0xc);
              local_2b3a = (bool)(~_Var7 & 1);
              local_2b38 = (bool *)lest::expression_decomposer::operator<<(&local_2b39,&local_2b3a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_2b30,(expression_lhs *)&local_2b38);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2b30);
              if (bVar2) {
                local_2bd9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2b88,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_2b89);
                lest::location::location(&local_2b68,&local_2b88,0x19e);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2bb0,"!(d > e1)",&local_2bb1);
                std::__cxx11::string::string((string *)&local_2bd8,(string *)&score_15);
                lest::failure::failure(pfVar9,&local_2b68,&local_2bb0,&local_2bd8);
                local_2bd9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2ca0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_2ca1);
                lest::location::location(&local_2c80,&local_2ca0,0x19e);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2cc8,"!(d > e1)",&local_2cc9);
                std::__cxx11::string::string((string *)&local_2cf0,(string *)&score_15);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2c58,&local_2c80,&local_2cc8,&local_2cf0,bVar2);
                lest::env::context_abi_cxx11_(&local_2d10,lest_env);
                lest::report(poVar1,&local_2c58,&local_2d10);
                std::__cxx11::string::~string((string *)&local_2d10);
                lest::passing::~passing((passing *)&local_2c58);
                std::__cxx11::string::~string((string *)&local_2cf0);
                std::__cxx11::string::~string((string *)&local_2cc8);
                std::allocator<char>::~allocator(&local_2cc9);
                lest::location::~location(&local_2c80);
                std::__cxx11::string::~string((string *)&local_2ca0);
                std::allocator<char>::~allocator(&local_2ca1);
              }
              lest::result::~result((result *)local_2b30);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_2ae0);
          lest__ctx_section_15._8_4_ =
               lest__ctx_section_15._8_4_ - (uint)(lest__ctx_section_15._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_17,&relop<char,_int,_long>::id416,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_17);
      if (bVar2) {
        lest__ctx_section_16.once = true;
        lest__ctx_section_16._9_3_ = 0;
        for (lest__ctx_section_16._12_4_ = 0;
            (int)lest__ctx_section_16._12_4_ < (int)lest__ctx_section_16._8_4_;
            lest__ctx_section_16._12_4_ = lest__ctx_section_16._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2dd0,"engaged    >= engaged",
                     (allocator<char> *)(score_16.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_2db0,lest_env,&local_2dd0);
          std::__cxx11::string::~string((string *)&local_2dd0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_16.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2db0), bVar2) {
            do {
              local_2e08 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_2e09,
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              lest::expression_lhs<std::optional<int>const&>::operator>=
                        ((result *)local_2e00,
                         (expression_lhs<std::optional<int>const&> *)&local_2e08,
                         (optional<int> *)
                         &e2.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>.field_0xc);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2e00);
              if (bVar2) {
                local_2ea9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2e58,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_2e59);
                lest::location::location(&local_2e38,&local_2e58,0x1a0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2e80,"e1 >= e1",&local_2e81);
                std::__cxx11::string::string((string *)&local_2ea8,(string *)&score_16);
                lest::failure::failure(pfVar9,&local_2e38,&local_2e80,&local_2ea8);
                local_2ea9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2f70,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_2f71);
                lest::location::location(&local_2f50,&local_2f70,0x1a0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2f98,"e1 >= e1",&local_2f99);
                std::__cxx11::string::string((string *)&local_2fc0,(string *)&score_16);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2f28,&local_2f50,&local_2f98,&local_2fc0,bVar2);
                lest::env::context_abi_cxx11_(&local_2fe0,lest_env);
                lest::report(poVar1,&local_2f28,&local_2fe0);
                std::__cxx11::string::~string((string *)&local_2fe0);
                lest::passing::~passing((passing *)&local_2f28);
                std::__cxx11::string::~string((string *)&local_2fc0);
                std::__cxx11::string::~string((string *)&local_2f98);
                std::allocator<char>::~allocator(&local_2f99);
                lest::location::~location(&local_2f50);
                std::__cxx11::string::~string((string *)&local_2f70);
                std::allocator<char>::~allocator(&local_2f71);
              }
              lest::result::~result((result *)local_2e00);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_2db0);
          lest__ctx_section_16._8_4_ =
               lest__ctx_section_16._8_4_ - (uint)(lest__ctx_section_16._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_18,&relop<char,_int,_long>::id417,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_18);
      if (bVar2) {
        lest__ctx_section_17.once = true;
        lest__ctx_section_17._9_3_ = 0;
        for (lest__ctx_section_17._12_4_ = 0;
            (int)lest__ctx_section_17._12_4_ < (int)lest__ctx_section_17._8_4_;
            lest__ctx_section_17._12_4_ = lest__ctx_section_17._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_30a0,"engaged    >= engaged",
                     (allocator<char> *)(score_17.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3080,lest_env,&local_30a0);
          std::__cxx11::string::~string((string *)&local_30a0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_17.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3080), bVar2) {
            do {
              local_30d8 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_30d9,(optional<long> *)local_80);
              lest::expression_lhs<std::optional<long>const&>::operator>=
                        ((result *)local_30d0,
                         (expression_lhs<std::optional<long>const&> *)&local_30d8,
                         (optional<int> *)
                         &e2.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>.field_0xc);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_30d0);
              if (bVar2) {
                local_3179 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3128,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_3129);
                lest::location::location(&local_3108,&local_3128,0x1a1);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3150,"e2 >= e1",&local_3151);
                std::__cxx11::string::string((string *)&local_3178,(string *)&score_17);
                lest::failure::failure(pfVar9,&local_3108,&local_3150,&local_3178);
                local_3179 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3240,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_3241);
                lest::location::location(&local_3220,&local_3240,0x1a1);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3268,"e2 >= e1",&local_3269);
                std::__cxx11::string::string((string *)&local_3290,(string *)&score_17);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_31f8,&local_3220,&local_3268,&local_3290,bVar2);
                lest::env::context_abi_cxx11_(&local_32b0,lest_env);
                lest::report(poVar1,&local_31f8,&local_32b0);
                std::__cxx11::string::~string((string *)&local_32b0);
                lest::passing::~passing((passing *)&local_31f8);
                std::__cxx11::string::~string((string *)&local_3290);
                std::__cxx11::string::~string((string *)&local_3268);
                std::allocator<char>::~allocator(&local_3269);
                lest::location::~location(&local_3220);
                std::__cxx11::string::~string((string *)&local_3240);
                std::allocator<char>::~allocator(&local_3241);
              }
              lest::result::~result((result *)local_30d0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_3080);
          lest__ctx_section_17._8_4_ =
               lest__ctx_section_17._8_4_ - (uint)(lest__ctx_section_17._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_19,&relop<char,_int,_long>::id418,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_19);
      if (bVar2) {
        lest__ctx_section_18.once = true;
        lest__ctx_section_18._9_3_ = 0;
        for (lest__ctx_section_18._12_4_ = 0;
            (int)lest__ctx_section_18._12_4_ < (int)lest__ctx_section_18._8_4_;
            lest__ctx_section_18._12_4_ = lest__ctx_section_18._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3370,"engaged    >= disengaged",
                     (allocator<char> *)(score_18.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3350,lest_env,&local_3370);
          std::__cxx11::string::~string((string *)&local_3370);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_18.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3350), bVar2) {
            do {
              local_33a8 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_33a9,(optional<long> *)local_80);
              lest::expression_lhs<std::optional<long>const&>::operator>=
                        ((result *)local_33a0,
                         (expression_lhs<std::optional<long>const&> *)&local_33a8,
                         (optional<char> *)
                         ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                 super__Optional_payload_base<int>._M_payload + 2));
              bVar2 = lest::result::operator_cast_to_bool((result *)local_33a0);
              if (bVar2) {
                local_3449 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_33f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_33f9);
                lest::location::location(&local_33d8,&local_33f8,0x1a2);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3420,"e2 >= d",&local_3421);
                std::__cxx11::string::string((string *)&local_3448,(string *)&score_18);
                lest::failure::failure(pfVar9,&local_33d8,&local_3420,&local_3448);
                local_3449 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3510,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_3511);
                lest::location::location(&local_34f0,&local_3510,0x1a2);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3538,"e2 >= d",&local_3539);
                std::__cxx11::string::string((string *)&local_3560,(string *)&score_18);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_34c8,&local_34f0,&local_3538,&local_3560,bVar2);
                lest::env::context_abi_cxx11_(&local_3580,lest_env);
                lest::report(poVar1,&local_34c8,&local_3580);
                std::__cxx11::string::~string((string *)&local_3580);
                lest::passing::~passing((passing *)&local_34c8);
                std::__cxx11::string::~string((string *)&local_3560);
                std::__cxx11::string::~string((string *)&local_3538);
                std::allocator<char>::~allocator(&local_3539);
                lest::location::~location(&local_34f0);
                std::__cxx11::string::~string((string *)&local_3510);
                std::allocator<char>::~allocator(&local_3511);
              }
              lest::result::~result((result *)local_33a0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_3350);
          lest__ctx_section_18._8_4_ =
               lest__ctx_section_18._8_4_ - (uint)(lest__ctx_section_18._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_20,&relop<char,_int,_long>::id419,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_20);
      if (bVar2) {
        lest__ctx_section_19.once = true;
        lest__ctx_section_19._9_3_ = 0;
        for (lest__ctx_section_19._12_4_ = 0;
            (int)lest__ctx_section_19._12_4_ < (int)lest__ctx_section_19._8_4_;
            lest__ctx_section_19._12_4_ = lest__ctx_section_19._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3640,"disengaged >= engaged",
                     (allocator<char> *)(score_19.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3620,lest_env,&local_3640);
          std::__cxx11::string::~string((string *)&local_3640);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_19.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3620), bVar2) {
            do {
              _Var8 = std::operator>=((optional<char> *)
                                      ((long)&e1.super__Optional_base<int,_true,_true>._M_payload.
                                              super__Optional_payload_base<int>._M_payload + 2),
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              local_367a = (bool)(~_Var8 & 1);
              local_3678 = (bool *)lest::expression_decomposer::operator<<(&local_3679,&local_367a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3670,(expression_lhs *)&local_3678);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3670);
              if (bVar2) {
                local_3719 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_36c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_36c9);
                lest::location::location(&local_36a8,&local_36c8,0x1a3);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_36f0,"!(d >= e1)",&local_36f1);
                std::__cxx11::string::string((string *)&local_3718,(string *)&score_19);
                lest::failure::failure(pfVar9,&local_36a8,&local_36f0,&local_3718);
                local_3719 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_37e0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_37e1);
                lest::location::location(&local_37c0,&local_37e0,0x1a3);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3808,"!(d >= e1)",&local_3809);
                std::__cxx11::string::string((string *)&local_3830,(string *)&score_19);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_3798,&local_37c0,&local_3808,&local_3830,bVar2);
                lest::env::context_abi_cxx11_(&local_3850,lest_env);
                lest::report(poVar1,&local_3798,&local_3850);
                std::__cxx11::string::~string((string *)&local_3850);
                lest::passing::~passing((passing *)&local_3798);
                std::__cxx11::string::~string((string *)&local_3830);
                std::__cxx11::string::~string((string *)&local_3808);
                std::allocator<char>::~allocator(&local_3809);
                lest::location::~location(&local_37c0);
                std::__cxx11::string::~string((string *)&local_37e0);
                std::allocator<char>::~allocator(&local_37e1);
              }
              lest::result::~result((result *)local_3670);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_3620);
          lest__ctx_section_19._8_4_ =
               lest__ctx_section_19._8_4_ - (uint)(lest__ctx_section_19._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_21,&relop<char,_int,_long>::id421,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_21);
      if (bVar2) {
        lest__ctx_section_20.once = true;
        lest__ctx_section_20._9_3_ = 0;
        for (lest__ctx_section_20._12_4_ = 0;
            (int)lest__ctx_section_20._12_4_ < (int)lest__ctx_section_20._8_4_;
            lest__ctx_section_20._12_4_ = lest__ctx_section_20._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3910,"disengaged == nullopt",
                     (allocator<char> *)(score_20.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_38f0,lest_env,&local_3910);
          std::__cxx11::string::~string((string *)&local_3910);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_20.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_38f0), bVar2) {
            do {
              local_394a = std::operator==((undefined1 *)
                                           ((long)&e1.super__Optional_base<int,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<int>.
                                                   _M_payload + 2));
              local_3948 = (bool *)lest::expression_decomposer::operator<<(&local_3949,&local_394a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3940,(expression_lhs *)&local_3948);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3940);
              if (bVar2) {
                local_39e9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3998,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_3999);
                lest::location::location(&local_3978,&local_3998,0x1a5);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_39c0,"(d == nullopt)",&local_39c1);
                std::__cxx11::string::string((string *)&local_39e8,(string *)&score_20);
                lest::failure::failure(pfVar9,&local_3978,&local_39c0,&local_39e8);
                local_39e9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3ab0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_3ab1);
                lest::location::location(&local_3a90,&local_3ab0,0x1a5);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3ad8,"(d == nullopt)",&local_3ad9);
                std::__cxx11::string::string((string *)&local_3b00,(string *)&score_20);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_3a68,&local_3a90,&local_3ad8,&local_3b00,bVar2);
                lest::env::context_abi_cxx11_(&local_3b20,lest_env);
                lest::report(poVar1,&local_3a68,&local_3b20);
                std::__cxx11::string::~string((string *)&local_3b20);
                lest::passing::~passing((passing *)&local_3a68);
                std::__cxx11::string::~string((string *)&local_3b00);
                std::__cxx11::string::~string((string *)&local_3ad8);
                std::allocator<char>::~allocator(&local_3ad9);
                lest::location::~location(&local_3a90);
                std::__cxx11::string::~string((string *)&local_3ab0);
                std::allocator<char>::~allocator(&local_3ab1);
              }
              lest::result::~result((result *)local_3940);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_38f0);
          lest__ctx_section_20._8_4_ =
               lest__ctx_section_20._8_4_ - (uint)(lest__ctx_section_20._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_22,&relop<char,_int,_long>::id422,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_22);
      if (bVar2) {
        lest__ctx_section_21.once = true;
        lest__ctx_section_21._9_3_ = 0;
        for (lest__ctx_section_21._12_4_ = 0;
            (int)lest__ctx_section_21._12_4_ < (int)lest__ctx_section_21._8_4_;
            lest__ctx_section_21._12_4_ = lest__ctx_section_21._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3be0,"nullopt    == disengaged",
                     (allocator<char> *)(score_21.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3bc0,lest_env,&local_3be0);
          std::__cxx11::string::~string((string *)&local_3be0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_21.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3bc0), bVar2) {
            do {
              local_3c1a = std::operator==((undefined1 *)
                                           ((long)&e1.super__Optional_base<int,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<int>.
                                                   _M_payload + 2));
              local_3c18 = (bool *)lest::expression_decomposer::operator<<(&local_3c19,&local_3c1a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3c10,(expression_lhs *)&local_3c18);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3c10);
              if (bVar2) {
                local_3cb9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3c68,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_3c69);
                lest::location::location(&local_3c48,&local_3c68,0x1a6);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3c90,"(nullopt == d )",&local_3c91);
                std::__cxx11::string::string((string *)&local_3cb8,(string *)&score_21);
                lest::failure::failure(pfVar9,&local_3c48,&local_3c90,&local_3cb8);
                local_3cb9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3d80,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_3d81);
                lest::location::location(&local_3d60,&local_3d80,0x1a6);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3da8,"(nullopt == d )",&local_3da9);
                std::__cxx11::string::string((string *)&local_3dd0,(string *)&score_21);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_3d38,&local_3d60,&local_3da8,&local_3dd0,bVar2);
                lest::env::context_abi_cxx11_(&local_3df0,lest_env);
                lest::report(poVar1,&local_3d38,&local_3df0);
                std::__cxx11::string::~string((string *)&local_3df0);
                lest::passing::~passing((passing *)&local_3d38);
                std::__cxx11::string::~string((string *)&local_3dd0);
                std::__cxx11::string::~string((string *)&local_3da8);
                std::allocator<char>::~allocator(&local_3da9);
                lest::location::~location(&local_3d60);
                std::__cxx11::string::~string((string *)&local_3d80);
                std::allocator<char>::~allocator(&local_3d81);
              }
              lest::result::~result((result *)local_3c10);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_3bc0);
          lest__ctx_section_21._8_4_ =
               lest__ctx_section_21._8_4_ - (uint)(lest__ctx_section_21._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_23,&relop<char,_int,_long>::id423,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_23);
      if (bVar2) {
        lest__ctx_section_22.once = true;
        lest__ctx_section_22._9_3_ = 0;
        for (lest__ctx_section_22._12_4_ = 0;
            (int)lest__ctx_section_22._12_4_ < (int)lest__ctx_section_22._8_4_;
            lest__ctx_section_22._12_4_ = lest__ctx_section_22._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3eb0,"engaged    == nullopt",
                     (allocator<char> *)(score_22.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_3e90,lest_env,&local_3eb0);
          std::__cxx11::string::~string((string *)&local_3eb0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_22.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3e90), bVar2) {
            do {
              local_3eea = std::operator!=(&e2.super__Optional_base<long,_true,_true>._M_payload.
                                            super__Optional_payload_base<long>.field_0xc);
              local_3ee8 = (bool *)lest::expression_decomposer::operator<<(&local_3ee9,&local_3eea);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_3ee0,(expression_lhs *)&local_3ee8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3ee0);
              if (bVar2) {
                local_3f89 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3f38,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_3f39);
                lest::location::location(&local_3f18,&local_3f38,0x1a7);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3f60,"(e1 != nullopt)",&local_3f61);
                std::__cxx11::string::string((string *)&local_3f88,(string *)&score_22);
                lest::failure::failure(pfVar9,&local_3f18,&local_3f60,&local_3f88);
                local_3f89 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4050,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_4051);
                lest::location::location(&local_4030,&local_4050,0x1a7);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4078,"(e1 != nullopt)",&local_4079);
                std::__cxx11::string::string((string *)&local_40a0,(string *)&score_22);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4008,&local_4030,&local_4078,&local_40a0,bVar2);
                lest::env::context_abi_cxx11_(&local_40c0,lest_env);
                lest::report(poVar1,&local_4008,&local_40c0);
                std::__cxx11::string::~string((string *)&local_40c0);
                lest::passing::~passing((passing *)&local_4008);
                std::__cxx11::string::~string((string *)&local_40a0);
                std::__cxx11::string::~string((string *)&local_4078);
                std::allocator<char>::~allocator(&local_4079);
                lest::location::~location(&local_4030);
                std::__cxx11::string::~string((string *)&local_4050);
                std::allocator<char>::~allocator(&local_4051);
              }
              lest::result::~result((result *)local_3ee0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_3e90);
          lest__ctx_section_22._8_4_ =
               lest__ctx_section_22._8_4_ - (uint)(lest__ctx_section_22._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_24,&relop<char,_int,_long>::id424,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_24);
      if (bVar2) {
        lest__ctx_section_23.once = true;
        lest__ctx_section_23._9_3_ = 0;
        for (lest__ctx_section_23._12_4_ = 0;
            (int)lest__ctx_section_23._12_4_ < (int)lest__ctx_section_23._8_4_;
            lest__ctx_section_23._12_4_ = lest__ctx_section_23._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4180,"nullopt    == engaged",
                     (allocator<char> *)(score_23.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_4160,lest_env,&local_4180);
          std::__cxx11::string::~string((string *)&local_4180);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_23.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4160), bVar2) {
            do {
              local_41ba = std::operator!=(&e2.super__Optional_base<long,_true,_true>._M_payload.
                                            super__Optional_payload_base<long>.field_0xc);
              local_41b8 = (bool *)lest::expression_decomposer::operator<<(&local_41b9,&local_41ba);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_41b0,(expression_lhs *)&local_41b8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_41b0);
              if (bVar2) {
                local_4259 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4208,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_4209);
                lest::location::location(&local_41e8,&local_4208,0x1a8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4230,"(nullopt != e1 )",&local_4231);
                std::__cxx11::string::string((string *)&local_4258,(string *)&score_23);
                lest::failure::failure(pfVar9,&local_41e8,&local_4230,&local_4258);
                local_4259 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4320,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_4321);
                lest::location::location(&local_4300,&local_4320,0x1a8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4348,"(nullopt != e1 )",&local_4349);
                std::__cxx11::string::string((string *)&local_4370,(string *)&score_23);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_42d8,&local_4300,&local_4348,&local_4370,bVar2);
                lest::env::context_abi_cxx11_(&local_4390,lest_env);
                lest::report(poVar1,&local_42d8,&local_4390);
                std::__cxx11::string::~string((string *)&local_4390);
                lest::passing::~passing((passing *)&local_42d8);
                std::__cxx11::string::~string((string *)&local_4370);
                std::__cxx11::string::~string((string *)&local_4348);
                std::allocator<char>::~allocator(&local_4349);
                lest::location::~location(&local_4300);
                std::__cxx11::string::~string((string *)&local_4320);
                std::allocator<char>::~allocator(&local_4321);
              }
              lest::result::~result((result *)local_41b0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_4160);
          lest__ctx_section_23._8_4_ =
               lest__ctx_section_23._8_4_ - (uint)(lest__ctx_section_23._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_25,&relop<char,_int,_long>::id425,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_25);
      if (bVar2) {
        lest__ctx_section_24.once = true;
        lest__ctx_section_24._9_3_ = 0;
        for (lest__ctx_section_24._12_4_ = 0;
            (int)lest__ctx_section_24._12_4_ < (int)lest__ctx_section_24._8_4_;
            lest__ctx_section_24._12_4_ = lest__ctx_section_24._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4450,"disengaged == nullopt",
                     (allocator<char> *)(score_24.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_4430,lest_env,&local_4450);
          std::__cxx11::string::~string((string *)&local_4450);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_24.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4430), bVar2) {
            do {
              local_448a = std::operator<((undefined1 *)
                                          ((long)&e1.super__Optional_base<int,_true,_true>.
                                                  _M_payload.super__Optional_payload_base<int>.
                                                  _M_payload + 2));
              local_448a = !local_448a;
              local_4488 = (bool *)lest::expression_decomposer::operator<<(&local_4489,&local_448a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4480,(expression_lhs *)&local_4488);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4480);
              if (bVar2) {
                local_4529 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_44d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_44d9);
                lest::location::location(&local_44b8,&local_44d8,0x1a9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4500,"!(d < nullopt)",&local_4501);
                std::__cxx11::string::string((string *)&local_4528,(string *)&score_24);
                lest::failure::failure(pfVar9,&local_44b8,&local_4500,&local_4528);
                local_4529 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_45f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_45f1);
                lest::location::location(&local_45d0,&local_45f0,0x1a9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4618,"!(d < nullopt)",&local_4619);
                std::__cxx11::string::string((string *)&local_4640,(string *)&score_24);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_45a8,&local_45d0,&local_4618,&local_4640,bVar2);
                lest::env::context_abi_cxx11_(&local_4660,lest_env);
                lest::report(poVar1,&local_45a8,&local_4660);
                std::__cxx11::string::~string((string *)&local_4660);
                lest::passing::~passing((passing *)&local_45a8);
                std::__cxx11::string::~string((string *)&local_4640);
                std::__cxx11::string::~string((string *)&local_4618);
                std::allocator<char>::~allocator(&local_4619);
                lest::location::~location(&local_45d0);
                std::__cxx11::string::~string((string *)&local_45f0);
                std::allocator<char>::~allocator(&local_45f1);
              }
              lest::result::~result((result *)local_4480);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_4430);
          lest__ctx_section_24._8_4_ =
               lest__ctx_section_24._8_4_ - (uint)(lest__ctx_section_24._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_26,&relop<char,_int,_long>::id426,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_26);
      if (bVar2) {
        lest__ctx_section_25.once = true;
        lest__ctx_section_25._9_3_ = 0;
        for (lest__ctx_section_25._12_4_ = 0;
            (int)lest__ctx_section_25._12_4_ < (int)lest__ctx_section_25._8_4_;
            lest__ctx_section_25._12_4_ = lest__ctx_section_25._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4720,"nullopt    == disengaged",
                     (allocator<char> *)(score_25.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_4700,lest_env,&local_4720);
          std::__cxx11::string::~string((string *)&local_4720);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_25.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4700), bVar2) {
            do {
              local_475a = std::operator<((undefined1 *)
                                          ((long)&e1.super__Optional_base<int,_true,_true>.
                                                  _M_payload.super__Optional_payload_base<int>.
                                                  _M_payload + 2));
              local_475a = !local_475a;
              local_4758 = (bool *)lest::expression_decomposer::operator<<(&local_4759,&local_475a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4750,(expression_lhs *)&local_4758);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4750);
              if (bVar2) {
                local_47f9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_47a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_47a9);
                lest::location::location(&local_4788,&local_47a8,0x1aa);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_47d0,"!(nullopt < d )",&local_47d1);
                std::__cxx11::string::string((string *)&local_47f8,(string *)&score_25);
                lest::failure::failure(pfVar9,&local_4788,&local_47d0,&local_47f8);
                local_47f9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_48c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_48c1);
                lest::location::location(&local_48a0,&local_48c0,0x1aa);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_48e8,"!(nullopt < d )",&local_48e9);
                std::__cxx11::string::string((string *)&local_4910,(string *)&score_25);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4878,&local_48a0,&local_48e8,&local_4910,bVar2);
                lest::env::context_abi_cxx11_(&local_4930,lest_env);
                lest::report(poVar1,&local_4878,&local_4930);
                std::__cxx11::string::~string((string *)&local_4930);
                lest::passing::~passing((passing *)&local_4878);
                std::__cxx11::string::~string((string *)&local_4910);
                std::__cxx11::string::~string((string *)&local_48e8);
                std::allocator<char>::~allocator(&local_48e9);
                lest::location::~location(&local_48a0);
                std::__cxx11::string::~string((string *)&local_48c0);
                std::allocator<char>::~allocator(&local_48c1);
              }
              lest::result::~result((result *)local_4750);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_4700);
          lest__ctx_section_25._8_4_ =
               lest__ctx_section_25._8_4_ - (uint)(lest__ctx_section_25._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_27,&relop<char,_int,_long>::id427,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_27);
      if (bVar2) {
        lest__ctx_section_26.once = true;
        lest__ctx_section_26._9_3_ = 0;
        for (lest__ctx_section_26._12_4_ = 0;
            (int)lest__ctx_section_26._12_4_ < (int)lest__ctx_section_26._8_4_;
            lest__ctx_section_26._12_4_ = lest__ctx_section_26._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_49f0,"disengaged == nullopt",
                     (allocator<char> *)(score_26.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_49d0,lest_env,&local_49f0);
          std::__cxx11::string::~string((string *)&local_49f0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_26.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_49d0), bVar2) {
            do {
              local_4a2a = std::operator<=((undefined1 *)
                                           ((long)&e1.super__Optional_base<int,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<int>.
                                                   _M_payload + 2));
              local_4a28 = (bool *)lest::expression_decomposer::operator<<(&local_4a29,&local_4a2a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4a20,(expression_lhs *)&local_4a28);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4a20);
              if (bVar2) {
                local_4ac9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4a78,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_4a79);
                lest::location::location(&local_4a58,&local_4a78,0x1ab);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4aa0,"(d <= nullopt)",&local_4aa1);
                std::__cxx11::string::string((string *)&local_4ac8,(string *)&score_26);
                lest::failure::failure(pfVar9,&local_4a58,&local_4aa0,&local_4ac8);
                local_4ac9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4b90,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_4b91);
                lest::location::location(&local_4b70,&local_4b90,0x1ab);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4bb8,"(d <= nullopt)",&local_4bb9);
                std::__cxx11::string::string((string *)&local_4be0,(string *)&score_26);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4b48,&local_4b70,&local_4bb8,&local_4be0,bVar2);
                lest::env::context_abi_cxx11_(&local_4c00,lest_env);
                lest::report(poVar1,&local_4b48,&local_4c00);
                std::__cxx11::string::~string((string *)&local_4c00);
                lest::passing::~passing((passing *)&local_4b48);
                std::__cxx11::string::~string((string *)&local_4be0);
                std::__cxx11::string::~string((string *)&local_4bb8);
                std::allocator<char>::~allocator(&local_4bb9);
                lest::location::~location(&local_4b70);
                std::__cxx11::string::~string((string *)&local_4b90);
                std::allocator<char>::~allocator(&local_4b91);
              }
              lest::result::~result((result *)local_4a20);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_49d0);
          lest__ctx_section_26._8_4_ =
               lest__ctx_section_26._8_4_ - (uint)(lest__ctx_section_26._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_28,&relop<char,_int,_long>::id428,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_28);
      if (bVar2) {
        lest__ctx_section_27.once = true;
        lest__ctx_section_27._9_3_ = 0;
        for (lest__ctx_section_27._12_4_ = 0;
            (int)lest__ctx_section_27._12_4_ < (int)lest__ctx_section_27._8_4_;
            lest__ctx_section_27._12_4_ = lest__ctx_section_27._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4cc0,"nullopt    == disengaged",
                     (allocator<char> *)(score_27.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_4ca0,lest_env,&local_4cc0);
          std::__cxx11::string::~string((string *)&local_4cc0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_27.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4ca0), bVar2) {
            do {
              local_4cfa = std::operator<=((undefined1 *)
                                           ((long)&e1.super__Optional_base<int,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<int>.
                                                   _M_payload + 2));
              local_4cf8 = (bool *)lest::expression_decomposer::operator<<(&local_4cf9,&local_4cfa);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4cf0,(expression_lhs *)&local_4cf8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4cf0);
              if (bVar2) {
                local_4d99 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4d48,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_4d49);
                lest::location::location(&local_4d28,&local_4d48,0x1ac);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4d70,"(nullopt <= d )",&local_4d71);
                std::__cxx11::string::string((string *)&local_4d98,(string *)&score_27);
                lest::failure::failure(pfVar9,&local_4d28,&local_4d70,&local_4d98);
                local_4d99 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4e60,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_4e61);
                lest::location::location(&local_4e40,&local_4e60,0x1ac);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_4e88,"(nullopt <= d )",&local_4e89);
                std::__cxx11::string::string((string *)&local_4eb0,(string *)&score_27);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4e18,&local_4e40,&local_4e88,&local_4eb0,bVar2);
                lest::env::context_abi_cxx11_(&local_4ed0,lest_env);
                lest::report(poVar1,&local_4e18,&local_4ed0);
                std::__cxx11::string::~string((string *)&local_4ed0);
                lest::passing::~passing((passing *)&local_4e18);
                std::__cxx11::string::~string((string *)&local_4eb0);
                std::__cxx11::string::~string((string *)&local_4e88);
                std::allocator<char>::~allocator(&local_4e89);
                lest::location::~location(&local_4e40);
                std::__cxx11::string::~string((string *)&local_4e60);
                std::allocator<char>::~allocator(&local_4e61);
              }
              lest::result::~result((result *)local_4cf0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_4ca0);
          lest__ctx_section_27._8_4_ =
               lest__ctx_section_27._8_4_ - (uint)(lest__ctx_section_27._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_29,&relop<char,_int,_long>::id429,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_29);
      if (bVar2) {
        lest__ctx_section_28.once = true;
        lest__ctx_section_28._9_3_ = 0;
        for (lest__ctx_section_28._12_4_ = 0;
            (int)lest__ctx_section_28._12_4_ < (int)lest__ctx_section_28._8_4_;
            lest__ctx_section_28._12_4_ = lest__ctx_section_28._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f90,"disengaged == nullopt",
                     (allocator<char> *)(score_28.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_4f70,lest_env,&local_4f90);
          std::__cxx11::string::~string((string *)&local_4f90);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_28.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4f70), bVar2) {
            do {
              local_4fca = std::operator>((undefined1 *)
                                          ((long)&e1.super__Optional_base<int,_true,_true>.
                                                  _M_payload.super__Optional_payload_base<int>.
                                                  _M_payload + 2));
              local_4fca = !local_4fca;
              local_4fc8 = (bool *)lest::expression_decomposer::operator<<(&local_4fc9,&local_4fca);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_4fc0,(expression_lhs *)&local_4fc8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4fc0);
              if (bVar2) {
                local_5069 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5018,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_5019);
                lest::location::location(&local_4ff8,&local_5018,0x1ad);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5040,"!(d > nullopt)",&local_5041);
                std::__cxx11::string::string((string *)&local_5068,(string *)&score_28);
                lest::failure::failure(pfVar9,&local_4ff8,&local_5040,&local_5068);
                local_5069 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5130,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_5131);
                lest::location::location(&local_5110,&local_5130,0x1ad);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5158,"!(d > nullopt)",&local_5159);
                std::__cxx11::string::string((string *)&local_5180,(string *)&score_28);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_50e8,&local_5110,&local_5158,&local_5180,bVar2);
                lest::env::context_abi_cxx11_(&local_51a0,lest_env);
                lest::report(poVar1,&local_50e8,&local_51a0);
                std::__cxx11::string::~string((string *)&local_51a0);
                lest::passing::~passing((passing *)&local_50e8);
                std::__cxx11::string::~string((string *)&local_5180);
                std::__cxx11::string::~string((string *)&local_5158);
                std::allocator<char>::~allocator(&local_5159);
                lest::location::~location(&local_5110);
                std::__cxx11::string::~string((string *)&local_5130);
                std::allocator<char>::~allocator(&local_5131);
              }
              lest::result::~result((result *)local_4fc0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_4f70);
          lest__ctx_section_28._8_4_ =
               lest__ctx_section_28._8_4_ - (uint)(lest__ctx_section_28._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_30,&relop<char,_int,_long>::id430,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_30);
      if (bVar2) {
        lest__ctx_section_29.once = true;
        lest__ctx_section_29._9_3_ = 0;
        for (lest__ctx_section_29._12_4_ = 0;
            (int)lest__ctx_section_29._12_4_ < (int)lest__ctx_section_29._8_4_;
            lest__ctx_section_29._12_4_ = lest__ctx_section_29._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5260,"nullopt    == disengaged",
                     (allocator<char> *)(score_29.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_5240,lest_env,&local_5260);
          std::__cxx11::string::~string((string *)&local_5260);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_29.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5240), bVar2) {
            do {
              local_529a = std::operator>((undefined1 *)
                                          ((long)&e1.super__Optional_base<int,_true,_true>.
                                                  _M_payload.super__Optional_payload_base<int>.
                                                  _M_payload + 2));
              local_529a = !local_529a;
              local_5298 = (bool *)lest::expression_decomposer::operator<<(&local_5299,&local_529a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_5290,(expression_lhs *)&local_5298);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5290);
              if (bVar2) {
                local_5339 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_52e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_52e9);
                lest::location::location(&local_52c8,&local_52e8,0x1ae);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5310,"!(nullopt > d )",&local_5311);
                std::__cxx11::string::string((string *)&local_5338,(string *)&score_29);
                lest::failure::failure(pfVar9,&local_52c8,&local_5310,&local_5338);
                local_5339 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5400,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_5401);
                lest::location::location(&local_53e0,&local_5400,0x1ae);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5428,"!(nullopt > d )",&local_5429);
                std::__cxx11::string::string((string *)&local_5450,(string *)&score_29);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_53b8,&local_53e0,&local_5428,&local_5450,bVar2);
                lest::env::context_abi_cxx11_(&local_5470,lest_env);
                lest::report(poVar1,&local_53b8,&local_5470);
                std::__cxx11::string::~string((string *)&local_5470);
                lest::passing::~passing((passing *)&local_53b8);
                std::__cxx11::string::~string((string *)&local_5450);
                std::__cxx11::string::~string((string *)&local_5428);
                std::allocator<char>::~allocator(&local_5429);
                lest::location::~location(&local_53e0);
                std::__cxx11::string::~string((string *)&local_5400);
                std::allocator<char>::~allocator(&local_5401);
              }
              lest::result::~result((result *)local_5290);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_5240);
          lest__ctx_section_29._8_4_ =
               lest__ctx_section_29._8_4_ - (uint)(lest__ctx_section_29._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_31,&relop<char,_int,_long>::id431,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_31);
      if (bVar2) {
        lest__ctx_section_30.once = true;
        lest__ctx_section_30._9_3_ = 0;
        for (lest__ctx_section_30._12_4_ = 0;
            (int)lest__ctx_section_30._12_4_ < (int)lest__ctx_section_30._8_4_;
            lest__ctx_section_30._12_4_ = lest__ctx_section_30._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5530,"disengaged == nullopt",
                     (allocator<char> *)(score_30.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_5510,lest_env,&local_5530);
          std::__cxx11::string::~string((string *)&local_5530);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_30.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5510), bVar2) {
            do {
              local_556a = std::operator>=((undefined1 *)
                                           ((long)&e1.super__Optional_base<int,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<int>.
                                                   _M_payload + 2));
              local_5568 = (bool *)lest::expression_decomposer::operator<<(&local_5569,&local_556a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_5560,(expression_lhs *)&local_5568);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5560);
              if (bVar2) {
                local_5609 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_55b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_55b9);
                lest::location::location(&local_5598,&local_55b8,0x1af);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_55e0,"(d >= nullopt)",&local_55e1);
                std::__cxx11::string::string((string *)&local_5608,(string *)&score_30);
                lest::failure::failure(pfVar9,&local_5598,&local_55e0,&local_5608);
                local_5609 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_56d0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_56d1);
                lest::location::location(&local_56b0,&local_56d0,0x1af);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_56f8,"(d >= nullopt)",&local_56f9);
                std::__cxx11::string::string((string *)&local_5720,(string *)&score_30);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_5688,&local_56b0,&local_56f8,&local_5720,bVar2);
                lest::env::context_abi_cxx11_(&local_5740,lest_env);
                lest::report(poVar1,&local_5688,&local_5740);
                std::__cxx11::string::~string((string *)&local_5740);
                lest::passing::~passing((passing *)&local_5688);
                std::__cxx11::string::~string((string *)&local_5720);
                std::__cxx11::string::~string((string *)&local_56f8);
                std::allocator<char>::~allocator(&local_56f9);
                lest::location::~location(&local_56b0);
                std::__cxx11::string::~string((string *)&local_56d0);
                std::allocator<char>::~allocator(&local_56d1);
              }
              lest::result::~result((result *)local_5560);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_5510);
          lest__ctx_section_30._8_4_ =
               lest__ctx_section_30._8_4_ - (uint)(lest__ctx_section_30._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_32,&relop<char,_int,_long>::id432,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_32);
      if (bVar2) {
        lest__ctx_section_31.once = true;
        lest__ctx_section_31._9_3_ = 0;
        for (lest__ctx_section_31._12_4_ = 0;
            (int)lest__ctx_section_31._12_4_ < (int)lest__ctx_section_31._8_4_;
            lest__ctx_section_31._12_4_ = lest__ctx_section_31._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5800,"nullopt    == disengaged",
                     (allocator<char> *)(score_31.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_57e0,lest_env,&local_5800);
          std::__cxx11::string::~string((string *)&local_5800);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_31.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_57e0), bVar2) {
            do {
              local_583a = std::operator>=((undefined1 *)
                                           ((long)&e1.super__Optional_base<int,_true,_true>.
                                                   _M_payload.super__Optional_payload_base<int>.
                                                   _M_payload + 2));
              local_5838 = (bool *)lest::expression_decomposer::operator<<(&local_5839,&local_583a);
              lest::expression_lhs::operator_cast_to_result
                        ((result *)local_5830,(expression_lhs *)&local_5838);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5830);
              if (bVar2) {
                local_58d9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5888,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_5889);
                lest::location::location(&local_5868,&local_5888,0x1b0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_58b0,"(nullopt >= d )",&local_58b1);
                std::__cxx11::string::string((string *)&local_58d8,(string *)&score_31);
                lest::failure::failure(pfVar9,&local_5868,&local_58b0,&local_58d8);
                local_58d9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_59a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_59a1);
                lest::location::location(&local_5980,&local_59a0,0x1b0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_59c8,"(nullopt >= d )",&local_59c9);
                std::__cxx11::string::string((string *)&local_59f0,(string *)&score_31);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_5958,&local_5980,&local_59c8,&local_59f0,bVar2);
                lest::env::context_abi_cxx11_(&local_5a10,lest_env);
                lest::report(poVar1,&local_5958,&local_5a10);
                std::__cxx11::string::~string((string *)&local_5a10);
                lest::passing::~passing((passing *)&local_5958);
                std::__cxx11::string::~string((string *)&local_59f0);
                std::__cxx11::string::~string((string *)&local_59c8);
                std::allocator<char>::~allocator(&local_59c9);
                lest::location::~location(&local_5980);
                std::__cxx11::string::~string((string *)&local_59a0);
                std::allocator<char>::~allocator(&local_59a1);
              }
              lest::result::~result((result *)local_5830);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_57e0);
          lest__ctx_section_31._8_4_ =
               lest__ctx_section_31._8_4_ - (uint)(lest__ctx_section_31._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_33,&relop<char,_int,_long>::id434,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_33);
      if (bVar2) {
        lest__ctx_section_32.once = true;
        lest__ctx_section_32._9_3_ = 0;
        for (lest__ctx_section_32._12_4_ = 0;
            (int)lest__ctx_section_32._12_4_ < (int)lest__ctx_section_32._8_4_;
            lest__ctx_section_32._12_4_ = lest__ctx_section_32._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5ad0,"engaged    == value",
                     (allocator<char> *)(score_32.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_5ab0,lest_env,&local_5ad0);
          std::__cxx11::string::~string((string *)&local_5ad0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_32.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5ab0), bVar2) {
            do {
              local_5b08 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_5b09,
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              local_5b10 = 6;
              lest::expression_lhs<std::optional<int>const&>::operator==
                        ((result *)local_5b00,
                         (expression_lhs<std::optional<int>const&> *)&local_5b08,&local_5b10);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5b00);
              if (bVar2) {
                local_5ba9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5b58,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_5b59);
                lest::location::location(&local_5b38,&local_5b58,0x1b2);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5b80,"e1 == 6",&local_5b81);
                std::__cxx11::string::string((string *)&local_5ba8,(string *)&score_32);
                lest::failure::failure(pfVar9,&local_5b38,&local_5b80,&local_5ba8);
                local_5ba9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5c70,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_5c71);
                lest::location::location(&local_5c50,&local_5c70,0x1b2);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5c98,"e1 == 6",&local_5c99);
                std::__cxx11::string::string((string *)&local_5cc0,(string *)&score_32);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_5c28,&local_5c50,&local_5c98,&local_5cc0,bVar2);
                lest::env::context_abi_cxx11_(&local_5ce0,lest_env);
                lest::report(poVar1,&local_5c28,&local_5ce0);
                std::__cxx11::string::~string((string *)&local_5ce0);
                lest::passing::~passing((passing *)&local_5c28);
                std::__cxx11::string::~string((string *)&local_5cc0);
                std::__cxx11::string::~string((string *)&local_5c98);
                std::allocator<char>::~allocator(&local_5c99);
                lest::location::~location(&local_5c50);
                std::__cxx11::string::~string((string *)&local_5c70);
                std::allocator<char>::~allocator(&local_5c71);
              }
              lest::result::~result((result *)local_5b00);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_5ab0);
          lest__ctx_section_32._8_4_ =
               lest__ctx_section_32._8_4_ - (uint)(lest__ctx_section_32._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_34,&relop<char,_int,_long>::id435,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_34);
      if (bVar2) {
        lest__ctx_section_33.once = true;
        lest__ctx_section_33._9_3_ = 0;
        for (lest__ctx_section_33._12_4_ = 0;
            (int)lest__ctx_section_33._12_4_ < (int)lest__ctx_section_33._8_4_;
            lest__ctx_section_33._12_4_ = lest__ctx_section_33._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5da0,"value     == engaged",
                     (allocator<char> *)(score_33.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_5d80,lest_env,&local_5da0);
          std::__cxx11::string::~string((string *)&local_5da0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_33.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5d80), bVar2) {
            do {
              local_5de0 = 6;
              local_5dd8 = (int *)lest::expression_decomposer::operator<<(&local_5dd9,&local_5de0);
              lest::expression_lhs<int_const&>::operator==
                        ((result *)local_5dd0,(expression_lhs<int_const&> *)&local_5dd8,
                         (optional<int> *)
                         &e2.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>.field_0xc);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5dd0);
              if (bVar2) {
                local_5e79 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5e28,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_5e29);
                lest::location::location(&local_5e08,&local_5e28,0x1b3);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5e50,"6 == e1",&local_5e51);
                std::__cxx11::string::string((string *)&local_5e78,(string *)&score_33);
                lest::failure::failure(pfVar9,&local_5e08,&local_5e50,&local_5e78);
                local_5e79 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5f40,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_5f41);
                lest::location::location(&local_5f20,&local_5f40,0x1b3);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_5f68,"6 == e1",&local_5f69);
                std::__cxx11::string::string((string *)&local_5f90,(string *)&score_33);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_5ef8,&local_5f20,&local_5f68,&local_5f90,bVar2);
                lest::env::context_abi_cxx11_(&local_5fb0,lest_env);
                lest::report(poVar1,&local_5ef8,&local_5fb0);
                std::__cxx11::string::~string((string *)&local_5fb0);
                lest::passing::~passing((passing *)&local_5ef8);
                std::__cxx11::string::~string((string *)&local_5f90);
                std::__cxx11::string::~string((string *)&local_5f68);
                std::allocator<char>::~allocator(&local_5f69);
                lest::location::~location(&local_5f20);
                std::__cxx11::string::~string((string *)&local_5f40);
                std::allocator<char>::~allocator(&local_5f41);
              }
              lest::result::~result((result *)local_5dd0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_5d80);
          lest__ctx_section_33._8_4_ =
               lest__ctx_section_33._8_4_ - (uint)(lest__ctx_section_33._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_35,&relop<char,_int,_long>::id436,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_35);
      if (bVar2) {
        lest__ctx_section_34.once = true;
        lest__ctx_section_34._9_3_ = 0;
        for (lest__ctx_section_34._12_4_ = 0;
            (int)lest__ctx_section_34._12_4_ < (int)lest__ctx_section_34._8_4_;
            lest__ctx_section_34._12_4_ = lest__ctx_section_34._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6070,"engaged   != value",
                     (allocator<char> *)(score_34.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_6050,lest_env,&local_6070);
          std::__cxx11::string::~string((string *)&local_6070);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_34.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_6050), bVar2) {
            do {
              local_60a8 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_60a9,
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              local_60b0 = 7;
              lest::expression_lhs<std::optional<int>const&>::operator!=
                        ((result *)local_60a0,
                         (expression_lhs<std::optional<int>const&> *)&local_60a8,&local_60b0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_60a0);
              if (bVar2) {
                local_6149 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_60f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_60f9);
                lest::location::location(&local_60d8,&local_60f8,0x1b4);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6120,"e1 != 7",&local_6121);
                std::__cxx11::string::string((string *)&local_6148,(string *)&score_34);
                lest::failure::failure(pfVar9,&local_60d8,&local_6120,&local_6148);
                local_6149 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6210,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_6211);
                lest::location::location(&local_61f0,&local_6210,0x1b4);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6238,"e1 != 7",&local_6239);
                std::__cxx11::string::string((string *)&local_6260,(string *)&score_34);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_61c8,&local_61f0,&local_6238,&local_6260,bVar2);
                lest::env::context_abi_cxx11_(&local_6280,lest_env);
                lest::report(poVar1,&local_61c8,&local_6280);
                std::__cxx11::string::~string((string *)&local_6280);
                lest::passing::~passing((passing *)&local_61c8);
                std::__cxx11::string::~string((string *)&local_6260);
                std::__cxx11::string::~string((string *)&local_6238);
                std::allocator<char>::~allocator(&local_6239);
                lest::location::~location(&local_61f0);
                std::__cxx11::string::~string((string *)&local_6210);
                std::allocator<char>::~allocator(&local_6211);
              }
              lest::result::~result((result *)local_60a0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_6050);
          lest__ctx_section_34._8_4_ =
               lest__ctx_section_34._8_4_ - (uint)(lest__ctx_section_34._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_36,&relop<char,_int,_long>::id437,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_36);
      if (bVar2) {
        lest__ctx_section_35.once = true;
        lest__ctx_section_35._9_3_ = 0;
        for (lest__ctx_section_35._12_4_ = 0;
            (int)lest__ctx_section_35._12_4_ < (int)lest__ctx_section_35._8_4_;
            lest__ctx_section_35._12_4_ = lest__ctx_section_35._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6340,"value     != engaged",
                     (allocator<char> *)(score_35.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_6320,lest_env,&local_6340);
          std::__cxx11::string::~string((string *)&local_6340);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_35.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_6320), bVar2) {
            do {
              local_6380 = 6;
              local_6378 = (int *)lest::expression_decomposer::operator<<(&local_6379,&local_6380);
              lest::expression_lhs<int_const&>::operator!=
                        ((result *)local_6370,(expression_lhs<int_const&> *)&local_6378,
                         (optional<long> *)local_80);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6370);
              if (bVar2) {
                local_6419 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_63c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_63c9);
                lest::location::location(&local_63a8,&local_63c8,0x1b5);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_63f0,"6 != e2",&local_63f1);
                std::__cxx11::string::string((string *)&local_6418,(string *)&score_35);
                lest::failure::failure(pfVar9,&local_63a8,&local_63f0,&local_6418);
                local_6419 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_64e0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_64e1);
                lest::location::location(&local_64c0,&local_64e0,0x1b5);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6508,"6 != e2",&local_6509);
                std::__cxx11::string::string((string *)&local_6530,(string *)&score_35);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6498,&local_64c0,&local_6508,&local_6530,bVar2);
                lest::env::context_abi_cxx11_(&local_6550,lest_env);
                lest::report(poVar1,&local_6498,&local_6550);
                std::__cxx11::string::~string((string *)&local_6550);
                lest::passing::~passing((passing *)&local_6498);
                std::__cxx11::string::~string((string *)&local_6530);
                std::__cxx11::string::~string((string *)&local_6508);
                std::allocator<char>::~allocator(&local_6509);
                lest::location::~location(&local_64c0);
                std::__cxx11::string::~string((string *)&local_64e0);
                std::allocator<char>::~allocator(&local_64e1);
              }
              lest::result::~result((result *)local_6370);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 0;
          lest::ctx::~ctx((ctx *)local_6320);
          lest__ctx_section_35._8_4_ =
               lest__ctx_section_35._8_4_ - (uint)(lest__ctx_section_35._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_37,&relop<char,_int,_long>::id438,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_37);
      if (bVar2) {
        lest__ctx_section_36.once = true;
        lest__ctx_section_36._9_3_ = 0;
        for (lest__ctx_section_36._12_4_ = 0;
            (int)lest__ctx_section_36._12_4_ < (int)lest__ctx_section_36._8_4_;
            lest__ctx_section_36._12_4_ = lest__ctx_section_36._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6610,"engaged   <  value",
                     (allocator<char> *)(score_36.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_65f0,lest_env,&local_6610);
          std::__cxx11::string::~string((string *)&local_6610);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_36.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_65f0), bVar2) {
            do {
              local_6648 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_6649,
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              local_6650 = 7;
              lest::expression_lhs<std::optional<int>const&>::operator<
                        ((result *)local_6640,
                         (expression_lhs<std::optional<int>const&> *)&local_6648,&local_6650);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6640);
              if (bVar2) {
                local_66e9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6698,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_6699);
                lest::location::location(&local_6678,&local_6698,0x1b6);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_66c0,"e1 < 7",&local_66c1);
                std::__cxx11::string::string((string *)&local_66e8,(string *)&score_36);
                lest::failure::failure(pfVar9,&local_6678,&local_66c0,&local_66e8);
                local_66e9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_67b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_67b1);
                lest::location::location(&local_6790,&local_67b0,0x1b6);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_67d8,"e1 < 7",&local_67d9);
                std::__cxx11::string::string((string *)&local_6800,(string *)&score_36);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6768,&local_6790,&local_67d8,&local_6800,bVar2);
                lest::env::context_abi_cxx11_(&local_6820,lest_env);
                lest::report(poVar1,&local_6768,&local_6820);
                std::__cxx11::string::~string((string *)&local_6820);
                lest::passing::~passing((passing *)&local_6768);
                std::__cxx11::string::~string((string *)&local_6800);
                std::__cxx11::string::~string((string *)&local_67d8);
                std::allocator<char>::~allocator(&local_67d9);
                lest::location::~location(&local_6790);
                std::__cxx11::string::~string((string *)&local_67b0);
                std::allocator<char>::~allocator(&local_67b1);
              }
              lest::result::~result((result *)local_6640);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 1;
          lest::ctx::~ctx((ctx *)local_65f0);
          lest__ctx_section_36._8_4_ =
               lest__ctx_section_36._8_4_ - (uint)(lest__ctx_section_36._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_38,&relop<char,_int,_long>::id439,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_38);
      if (bVar2) {
        lest__ctx_section_37.once = true;
        lest__ctx_section_37._9_3_ = 0;
        for (lest__ctx_section_37._12_4_ = 0;
            (int)lest__ctx_section_37._12_4_ < (int)lest__ctx_section_37._8_4_;
            lest__ctx_section_37._12_4_ = lest__ctx_section_37._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68e0,"value     <  engaged",
                     (allocator<char> *)(score_37.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_68c0,lest_env,&local_68e0);
          std::__cxx11::string::~string((string *)&local_68e0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_37.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_68c0), bVar2) {
            do {
              local_6920 = 6;
              local_6918 = (int *)lest::expression_decomposer::operator<<(&local_6919,&local_6920);
              lest::expression_lhs<int_const&>::operator<
                        ((result *)local_6910,(expression_lhs<int_const&> *)&local_6918,
                         (optional<long> *)local_80);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6910);
              if (bVar2) {
                local_69b9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6968,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_6969);
                lest::location::location(&local_6948,&local_6968,0x1b7);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6990,"6 < e2",&local_6991);
                std::__cxx11::string::string((string *)&local_69b8,(string *)&score_37);
                lest::failure::failure(pfVar9,&local_6948,&local_6990,&local_69b8);
                local_69b9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6a80,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_6a81);
                lest::location::location(&local_6a60,&local_6a80,0x1b7);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6aa8,"6 < e2",&local_6aa9);
                std::__cxx11::string::string((string *)&local_6ad0,(string *)&score_37);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6a38,&local_6a60,&local_6aa8,&local_6ad0,bVar2);
                lest::env::context_abi_cxx11_(&local_6af0,lest_env);
                lest::report(poVar1,&local_6a38,&local_6af0);
                std::__cxx11::string::~string((string *)&local_6af0);
                lest::passing::~passing((passing *)&local_6a38);
                std::__cxx11::string::~string((string *)&local_6ad0);
                std::__cxx11::string::~string((string *)&local_6aa8);
                std::allocator<char>::~allocator(&local_6aa9);
                lest::location::~location(&local_6a60);
                std::__cxx11::string::~string((string *)&local_6a80);
                std::allocator<char>::~allocator(&local_6a81);
              }
              lest::result::~result((result *)local_6910);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 1;
          lest::ctx::~ctx((ctx *)local_68c0);
          lest__ctx_section_37._8_4_ =
               lest__ctx_section_37._8_4_ - (uint)(lest__ctx_section_37._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_39,&relop<char,_int,_long>::id440,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_39);
      if (bVar2) {
        lest__ctx_section_38.once = true;
        lest__ctx_section_38._9_3_ = 0;
        for (lest__ctx_section_38._12_4_ = 0;
            (int)lest__ctx_section_38._12_4_ < (int)lest__ctx_section_38._8_4_;
            lest__ctx_section_38._12_4_ = lest__ctx_section_38._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6bb0,"engaged   <= value",
                     (allocator<char> *)(score_38.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_6b90,lest_env,&local_6bb0);
          std::__cxx11::string::~string((string *)&local_6bb0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_38.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_6b90), bVar2) {
            do {
              local_6be8 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_6be9,
                                      (optional<int> *)
                                      &e2.super__Optional_base<long,_true,_true>._M_payload.
                                       super__Optional_payload_base<long>.field_0xc);
              local_6bf0 = 7;
              lest::expression_lhs<std::optional<int>const&>::operator<=
                        ((result *)local_6be0,
                         (expression_lhs<std::optional<int>const&> *)&local_6be8,&local_6bf0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6be0);
              if (bVar2) {
                local_6c89 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6c38,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_6c39);
                lest::location::location(&local_6c18,&local_6c38,0x1b8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6c60,"e1 <= 7",&local_6c61);
                std::__cxx11::string::string((string *)&local_6c88,(string *)&score_38);
                lest::failure::failure(pfVar9,&local_6c18,&local_6c60,&local_6c88);
                local_6c89 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6d50,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_6d51);
                lest::location::location(&local_6d30,&local_6d50,0x1b8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6d78,"e1 <= 7",&local_6d79);
                std::__cxx11::string::string((string *)&local_6da0,(string *)&score_38);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6d08,&local_6d30,&local_6d78,&local_6da0,bVar2);
                lest::env::context_abi_cxx11_(&local_6dc0,lest_env);
                lest::report(poVar1,&local_6d08,&local_6dc0);
                std::__cxx11::string::~string((string *)&local_6dc0);
                lest::passing::~passing((passing *)&local_6d08);
                std::__cxx11::string::~string((string *)&local_6da0);
                std::__cxx11::string::~string((string *)&local_6d78);
                std::allocator<char>::~allocator(&local_6d79);
                lest::location::~location(&local_6d30);
                std::__cxx11::string::~string((string *)&local_6d50);
                std::allocator<char>::~allocator(&local_6d51);
              }
              lest::result::~result((result *)local_6be0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 1;
          lest::ctx::~ctx((ctx *)local_6b90);
          lest__ctx_section_38._8_4_ =
               lest__ctx_section_38._8_4_ - (uint)(lest__ctx_section_38._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_40,&relop<char,_int,_long>::id441,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_40);
      if (bVar2) {
        lest__ctx_section_39.once = true;
        lest__ctx_section_39._9_3_ = 0;
        for (lest__ctx_section_39._12_4_ = 0;
            (int)lest__ctx_section_39._12_4_ < (int)lest__ctx_section_39._8_4_;
            lest__ctx_section_39._12_4_ = lest__ctx_section_39._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e80,"value     <= engaged",
                     (allocator<char> *)(score_39.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_6e60,lest_env,&local_6e80);
          std::__cxx11::string::~string((string *)&local_6e80);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_39.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_6e60), bVar2) {
            do {
              local_6ec0 = 6;
              local_6eb8 = (int *)lest::expression_decomposer::operator<<(&local_6eb9,&local_6ec0);
              lest::expression_lhs<int_const&>::operator<=
                        ((result *)local_6eb0,(expression_lhs<int_const&> *)&local_6eb8,
                         (optional<long> *)local_80);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6eb0);
              if (bVar2) {
                local_6f59 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6f08,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_6f09);
                lest::location::location(&local_6ee8,&local_6f08,0x1b9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_6f30,"6 <= e2",&local_6f31);
                std::__cxx11::string::string((string *)&local_6f58,(string *)&score_39);
                lest::failure::failure(pfVar9,&local_6ee8,&local_6f30,&local_6f58);
                local_6f59 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7020,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_7021);
                lest::location::location(&local_7000,&local_7020,0x1b9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7048,"6 <= e2",&local_7049);
                std::__cxx11::string::string((string *)&local_7070,(string *)&score_39);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6fd8,&local_7000,&local_7048,&local_7070,bVar2);
                lest::env::context_abi_cxx11_(&local_7090,lest_env);
                lest::report(poVar1,&local_6fd8,&local_7090);
                std::__cxx11::string::~string((string *)&local_7090);
                lest::passing::~passing((passing *)&local_6fd8);
                std::__cxx11::string::~string((string *)&local_7070);
                std::__cxx11::string::~string((string *)&local_7048);
                std::allocator<char>::~allocator(&local_7049);
                lest::location::~location(&local_7000);
                std::__cxx11::string::~string((string *)&local_7020);
                std::allocator<char>::~allocator(&local_7021);
              }
              lest::result::~result((result *)local_6eb0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 1;
          lest::ctx::~ctx((ctx *)local_6e60);
          lest__ctx_section_39._8_4_ =
               lest__ctx_section_39._8_4_ - (uint)(lest__ctx_section_39._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_41,&relop<char,_int,_long>::id442,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_41);
      if (bVar2) {
        lest__ctx_section_40.once = true;
        lest__ctx_section_40._9_3_ = 0;
        for (lest__ctx_section_40._12_4_ = 0;
            (int)lest__ctx_section_40._12_4_ < (int)lest__ctx_section_40._8_4_;
            lest__ctx_section_40._12_4_ = lest__ctx_section_40._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7150,"engaged   >  value",
                     (allocator<char> *)(score_40.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_7130,lest_env,&local_7150);
          std::__cxx11::string::~string((string *)&local_7150);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_40.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_7130), bVar2) {
            do {
              local_7188 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_7189,(optional<long> *)local_80);
              local_7190 = 6;
              lest::expression_lhs<std::optional<long>const&>::operator>
                        ((result *)local_7180,
                         (expression_lhs<std::optional<long>const&> *)&local_7188,&local_7190);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_7180);
              if (bVar2) {
                local_7229 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_71d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_71d9);
                lest::location::location(&local_71b8,&local_71d8,0x1ba);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7200,"e2 > 6",&local_7201);
                std::__cxx11::string::string((string *)&local_7228,(string *)&score_40);
                lest::failure::failure(pfVar9,&local_71b8,&local_7200,&local_7228);
                local_7229 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_72f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_72f1);
                lest::location::location(&local_72d0,&local_72f0,0x1ba);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7318,"e2 > 6",&local_7319);
                std::__cxx11::string::string((string *)&local_7340,(string *)&score_40);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_72a8,&local_72d0,&local_7318,&local_7340,bVar2);
                lest::env::context_abi_cxx11_(&local_7360,lest_env);
                lest::report(poVar1,&local_72a8,&local_7360);
                std::__cxx11::string::~string((string *)&local_7360);
                lest::passing::~passing((passing *)&local_72a8);
                std::__cxx11::string::~string((string *)&local_7340);
                std::__cxx11::string::~string((string *)&local_7318);
                std::allocator<char>::~allocator(&local_7319);
                lest::location::~location(&local_72d0);
                std::__cxx11::string::~string((string *)&local_72f0);
                std::allocator<char>::~allocator(&local_72f1);
              }
              lest::result::~result((result *)local_7180);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 1;
          lest::ctx::~ctx((ctx *)local_7130);
          lest__ctx_section_40._8_4_ =
               lest__ctx_section_40._8_4_ - (uint)(lest__ctx_section_40._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_42,&relop<char,_int,_long>::id443,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_42);
      if (bVar2) {
        lest__ctx_section_41.once = true;
        lest__ctx_section_41._9_3_ = 0;
        for (lest__ctx_section_41._12_4_ = 0;
            (int)lest__ctx_section_41._12_4_ < (int)lest__ctx_section_41._8_4_;
            lest__ctx_section_41._12_4_ = lest__ctx_section_41._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_7420,"value     >  engaged",
                     (allocator<char> *)(score_41.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_7400,lest_env,&local_7420);
          std::__cxx11::string::~string((string *)&local_7420);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_41.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_7400), bVar2) {
            do {
              local_7460 = 7;
              local_7458 = (int *)lest::expression_decomposer::operator<<(&local_7459,&local_7460);
              lest::expression_lhs<int_const&>::operator>
                        ((result *)local_7450,(expression_lhs<int_const&> *)&local_7458,
                         (optional<int> *)
                         &e2.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>.field_0xc);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_7450);
              if (bVar2) {
                local_74f9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_74a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_74a9);
                lest::location::location(&local_7488,&local_74a8,0x1bb);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_74d0,"7 > e1",&local_74d1);
                std::__cxx11::string::string((string *)&local_74f8,(string *)&score_41);
                lest::failure::failure(pfVar9,&local_7488,&local_74d0,&local_74f8);
                local_74f9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_75c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_75c1);
                lest::location::location(&local_75a0,&local_75c0,0x1bb);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_75e8,"7 > e1",&local_75e9);
                std::__cxx11::string::string((string *)&local_7610,(string *)&score_41);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_7578,&local_75a0,&local_75e8,&local_7610,bVar2);
                lest::env::context_abi_cxx11_(&local_7630,lest_env);
                lest::report(poVar1,&local_7578,&local_7630);
                std::__cxx11::string::~string((string *)&local_7630);
                lest::passing::~passing((passing *)&local_7578);
                std::__cxx11::string::~string((string *)&local_7610);
                std::__cxx11::string::~string((string *)&local_75e8);
                std::allocator<char>::~allocator(&local_75e9);
                lest::location::~location(&local_75a0);
                std::__cxx11::string::~string((string *)&local_75c0);
                std::allocator<char>::~allocator(&local_75c1);
              }
              lest::result::~result((result *)local_7450);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 1;
          lest::ctx::~ctx((ctx *)local_7400);
          lest__ctx_section_41._8_4_ =
               lest__ctx_section_41._8_4_ - (uint)(lest__ctx_section_41._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_43,&relop<char,_int,_long>::id444,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_43);
      if (bVar2) {
        lest__ctx_section_42.once = true;
        lest__ctx_section_42._9_3_ = 0;
        for (lest__ctx_section_42._12_4_ = 0;
            (int)lest__ctx_section_42._12_4_ < (int)lest__ctx_section_42._8_4_;
            lest__ctx_section_42._12_4_ = lest__ctx_section_42._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_76f0,"engaged   >= value",
                     (allocator<char> *)(score_42.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_76d0,lest_env,&local_76f0);
          std::__cxx11::string::~string((string *)&local_76f0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_42.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_76d0), bVar2) {
            do {
              local_7728 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_7729,(optional<long> *)local_80);
              local_7730 = 6;
              lest::expression_lhs<std::optional<long>const&>::operator>=
                        ((result *)local_7720,
                         (expression_lhs<std::optional<long>const&> *)&local_7728,&local_7730);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_7720);
              if (bVar2) {
                local_77c9 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7778,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_7779);
                lest::location::location(&local_7758,&local_7778,0x1bc);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_77a0,"e2 >= 6",&local_77a1);
                std::__cxx11::string::string((string *)&local_77c8,(string *)&score_42);
                lest::failure::failure(pfVar9,&local_7758,&local_77a0,&local_77c8);
                local_77c9 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7890,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_7891);
                lest::location::location(&local_7870,&local_7890,0x1bc);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_78b8,"e2 >= 6",&local_78b9);
                std::__cxx11::string::string((string *)&local_78e0,(string *)&score_42);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_7848,&local_7870,&local_78b8,&local_78e0,bVar2);
                lest::env::context_abi_cxx11_(&local_7900,lest_env);
                lest::report(poVar1,&local_7848,&local_7900);
                std::__cxx11::string::~string((string *)&local_7900);
                lest::passing::~passing((passing *)&local_7848);
                std::__cxx11::string::~string((string *)&local_78e0);
                std::__cxx11::string::~string((string *)&local_78b8);
                std::allocator<char>::~allocator(&local_78b9);
                lest::location::~location(&local_7870);
                std::__cxx11::string::~string((string *)&local_7890);
                std::allocator<char>::~allocator(&local_7891);
              }
              lest::result::~result((result *)local_7720);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 1;
          lest::ctx::~ctx((ctx *)local_76d0);
          lest__ctx_section_42._8_4_ =
               lest__ctx_section_42._8_4_ - (uint)(lest__ctx_section_42._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_44,&relop<char,_int,_long>::id445,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_44);
      if (bVar2) {
        lest__ctx_section_43.once = true;
        lest__ctx_section_43._9_3_ = 0;
        for (lest__ctx_section_43._12_4_ = 0;
            (int)lest__ctx_section_43._12_4_ < (int)lest__ctx_section_43._8_4_;
            lest__ctx_section_43._12_4_ = lest__ctx_section_43._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_79c0,"value     >= engaged",
                     (allocator<char> *)(score_43.decomposition.field_2._M_local_buf + 0xf));
          lest::ctx::ctx((ctx *)local_79a0,lest_env,&local_79c0);
          std::__cxx11::string::~string((string *)&local_79c0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(score_43.decomposition.field_2._M_local_buf + 0xf));
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_79a0), bVar2) {
            do {
              local_7a00 = 7;
              local_79f8 = (int *)lest::expression_decomposer::operator<<(&local_79f9,&local_7a00);
              lest::expression_lhs<int_const&>::operator>=
                        ((result *)local_79f0,(expression_lhs<int_const&> *)&local_79f8,
                         (optional<int> *)
                         &e2.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>.field_0xc);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_79f0);
              if (bVar2) {
                local_7a99 = 1;
                pfVar9 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7a48,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_7a49);
                lest::location::location(&local_7a28,&local_7a48,0x1bd);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7a70,"7 >= e1",&local_7a71);
                std::__cxx11::string::string((string *)&local_7a98,(string *)&score_43);
                lest::failure::failure(pfVar9,&local_7a28,&local_7a70,&local_7a98);
                local_7a99 = 0;
                __cxa_throw(pfVar9,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7b60,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-bare/test/optional.t.cpp"
                           ,&local_7b61);
                lest::location::location(&local_7b40,&local_7b60,0x1bd);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_7b88,"7 >= e1",&local_7b89);
                std::__cxx11::string::string((string *)&local_7bb0,(string *)&score_43);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_7b18,&local_7b40,&local_7b88,&local_7bb0,bVar2);
                lest::env::context_abi_cxx11_(&local_7bd0,lest_env);
                lest::report(poVar1,&local_7b18,&local_7bd0);
                std::__cxx11::string::~string((string *)&local_7bd0);
                lest::passing::~passing((passing *)&local_7b18);
                std::__cxx11::string::~string((string *)&local_7bb0);
                std::__cxx11::string::~string((string *)&local_7b88);
                std::allocator<char>::~allocator(&local_7b89);
                lest::location::~location(&local_7b40);
                std::__cxx11::string::~string((string *)&local_7b60);
                std::allocator<char>::~allocator(&local_7b61);
              }
              lest::result::~result((result *)local_79f0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_engaged = true;
          e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _5_3_ = 1;
          lest::ctx::~ctx((ctx *)local_79a0);
          lest__ctx_section_43._8_4_ =
               lest__ctx_section_43._8_4_ - (uint)(lest__ctx_section_43._12_4_ == 0);
        }
      }
    }
    e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_engaged
         = true;
    e1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._5_3_ = 0;
    lest::ctx::~ctx((ctx *)local_28);
    lest__ctx_setup._8_4_ = lest__ctx_setup._8_4_ - (uint)(lest__ctx_setup._12_4_ == 0);
    lest__ctx_setup._12_4_ = lest__ctx_setup._12_4_ + 1;
  } while( true );
}

Assistant:

void relop( lest::env & lest_env )
{
    SETUP( "" ) {
        optional<R> d;
        optional<S> e1( 6 );
        optional<T> e2( 7 );

    SECTION( "engaged    == engaged"    ) { EXPECT(   e1 == e1  ); }
    SECTION( "engaged    == disengaged" ) { EXPECT( !(e1 == d ) ); }
    SECTION( "disengaged == engaged"    ) { EXPECT( !(d  == e1) ); }

    SECTION( "engaged    != engaged"    ) { EXPECT(   e1 != e2  ); }
    SECTION( "engaged    != disengaged" ) { EXPECT(   e1 != d   ); }
    SECTION( "disengaged != engaged"    ) { EXPECT(   d  != e2  ); }

    SECTION( "engaged    <  engaged"    ) { EXPECT(   e1 <  e2  ); }
    SECTION( "engaged    <  disengaged" ) { EXPECT( !(e1 <  d ) ); }
    SECTION( "disengaged <  engaged"    ) { EXPECT(   d  <  e2  ); }

    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e1  ); }
    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e2  ); }
    SECTION( "engaged    <= disengaged" ) { EXPECT( !(e1 <= d ) ); }
    SECTION( "disengaged <= engaged"    ) { EXPECT(   d  <= e2  ); }

    SECTION( "engaged    >  engaged"    ) { EXPECT(   e2 >  e1  ); }
    SECTION( "engaged    >  disengaged" ) { EXPECT(   e2 >  d   ); }
    SECTION( "disengaged >  engaged"    ) { EXPECT( !(d  >  e1) ); }

    SECTION( "engaged    >= engaged"    ) { EXPECT(   e1 >= e1  ); }
    SECTION( "engaged    >= engaged"    ) { EXPECT(   e2 >= e1  ); }
    SECTION( "engaged    >= disengaged" ) { EXPECT(   e2 >= d   ); }
    SECTION( "disengaged >= engaged"    ) { EXPECT( !(d  >= e1) ); }

    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       == nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt == d      ) ); }
    SECTION( "engaged    == nullopt"    ) { EXPECT(  (e1      != nullopt) ); }
    SECTION( "nullopt    == engaged"    ) { EXPECT(  (nullopt != e1     ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       <  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt <  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       <= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt <= d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       >  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt >  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       >= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt >= d      ) ); }

    SECTION( "engaged    == value"      ) { EXPECT( e1 == 6  ); }
    SECTION( "value     == engaged"     ) { EXPECT(  6 == e1 ); }
    SECTION( "engaged   != value"       ) { EXPECT( e1 != 7  ); }
    SECTION( "value     != engaged"     ) { EXPECT(  6 != e2 ); }
    SECTION( "engaged   <  value"       ) { EXPECT( e1 <  7  ); }
    SECTION( "value     <  engaged"     ) { EXPECT(  6 <  e2 ); }
    SECTION( "engaged   <= value"       ) { EXPECT( e1 <= 7  ); }
    SECTION( "value     <= engaged"     ) { EXPECT(  6 <= e2 ); }
    SECTION( "engaged   >  value"       ) { EXPECT( e2 >  6  ); }
    SECTION( "value     >  engaged"     ) { EXPECT(  7 >  e1 ); }
    SECTION( "engaged   >= value"       ) { EXPECT( e2 >= 6  ); }
    SECTION( "value     >= engaged"     ) { EXPECT(  7 >= e1 ); }
    }
}